

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  byte bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  ulong uVar70;
  undefined4 uVar71;
  undefined8 in_R11;
  bool bVar72;
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar75 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar105 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float t1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar205 [32];
  float fVar210;
  float fVar215;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar214;
  undefined1 auVar208 [32];
  float fVar216;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [16];
  float fVar226;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar227;
  float fVar229;
  float fVar230;
  undefined1 auVar222 [32];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar244;
  float fVar245;
  vfloat4 b0;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar246;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar250;
  float fVar251;
  float fVar261;
  float fVar262;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar260 [32];
  float fVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  undefined1 auVar277 [32];
  __m128 a;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  vfloat4 a0_1;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar303;
  float fVar307;
  float fVar308;
  vfloat4 a0;
  undefined1 auVar304 [16];
  float fVar309;
  undefined1 auVar305 [16];
  float fVar310;
  float fVar311;
  float fVar312;
  float in_register_0000151c;
  undefined1 auVar306 [32];
  float fVar313;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  float fVar317;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float in_register_0000159c;
  undefined1 auVar325 [64];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar332;
  float in_register_000015dc;
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  uint auStack_4d0 [4];
  RTCFilterFunctionNArguments local_4c0;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar69;
  undefined1 auVar223 [32];
  undefined1 auVar324 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar196 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar196 = vinsertps_avx(auVar196,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar231 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar101._0_4_ = fVar231 * auVar79._0_4_;
  auVar101._4_4_ = fVar231 * auVar79._4_4_;
  auVar101._8_4_ = fVar231 * auVar79._8_4_;
  auVar101._12_4_ = fVar231 * auVar79._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 10)));
  auVar217._0_4_ = fVar231 * auVar196._0_4_;
  auVar217._4_4_ = fVar231 * auVar196._4_4_;
  auVar217._8_4_ = fVar231 * auVar196._8_4_;
  auVar217._12_4_ = fVar231 * auVar196._12_4_;
  auVar90._16_16_ = auVar151;
  auVar90._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 10)));
  auVar153._16_16_ = auVar196;
  auVar153._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar153);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 10)));
  auVar168._16_16_ = auVar196;
  auVar168._0_16_ = auVar79;
  auVar15 = vcvtdq2ps_avx(auVar168);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 10)));
  auVar169._16_16_ = auVar196;
  auVar169._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 10)));
  auVar16 = vcvtdq2ps_avx(auVar169);
  auVar205._16_16_ = auVar196;
  auVar205._0_16_ = auVar79;
  auVar17 = vcvtdq2ps_avx(auVar205);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 10)));
  auVar239._16_16_ = auVar196;
  auVar239._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar239);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 10)));
  auVar240._16_16_ = auVar196;
  auVar240._0_16_ = auVar79;
  auVar19 = vcvtdq2ps_avx(auVar240);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 10)));
  auVar274._16_16_ = auVar196;
  auVar274._0_16_ = auVar79;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar274);
  auVar291._16_16_ = auVar196;
  auVar291._0_16_ = auVar79;
  auVar21 = vcvtdq2ps_avx(auVar291);
  auVar79 = vshufps_avx(auVar217,auVar217,0);
  auVar196 = vshufps_avx(auVar217,auVar217,0x55);
  auVar151 = vshufps_avx(auVar217,auVar217,0xaa);
  fVar231 = auVar151._0_4_;
  fVar191 = auVar151._4_4_;
  fVar244 = auVar151._8_4_;
  fVar209 = auVar151._12_4_;
  fVar245 = auVar196._0_4_;
  fVar215 = auVar196._4_4_;
  fVar246 = auVar196._8_4_;
  fVar210 = auVar196._12_4_;
  fVar247 = auVar79._0_4_;
  fVar211 = auVar79._4_4_;
  fVar248 = auVar79._8_4_;
  fVar212 = auVar79._12_4_;
  auVar306._0_4_ = fVar247 * auVar90._0_4_ + fVar245 * auVar14._0_4_ + fVar231 * auVar15._0_4_;
  auVar306._4_4_ = fVar211 * auVar90._4_4_ + fVar215 * auVar14._4_4_ + fVar191 * auVar15._4_4_;
  auVar306._8_4_ = fVar248 * auVar90._8_4_ + fVar246 * auVar14._8_4_ + fVar244 * auVar15._8_4_;
  auVar306._12_4_ = fVar212 * auVar90._12_4_ + fVar210 * auVar14._12_4_ + fVar209 * auVar15._12_4_;
  auVar306._16_4_ = fVar247 * auVar90._16_4_ + fVar245 * auVar14._16_4_ + fVar231 * auVar15._16_4_;
  auVar306._20_4_ = fVar211 * auVar90._20_4_ + fVar215 * auVar14._20_4_ + fVar191 * auVar15._20_4_;
  auVar306._24_4_ = fVar248 * auVar90._24_4_ + fVar246 * auVar14._24_4_ + fVar244 * auVar15._24_4_;
  auVar306._28_4_ = fVar210 + in_register_000015dc + in_register_0000151c;
  auVar300._0_4_ = fVar247 * auVar16._0_4_ + fVar245 * auVar17._0_4_ + auVar18._0_4_ * fVar231;
  auVar300._4_4_ = fVar211 * auVar16._4_4_ + fVar215 * auVar17._4_4_ + auVar18._4_4_ * fVar191;
  auVar300._8_4_ = fVar248 * auVar16._8_4_ + fVar246 * auVar17._8_4_ + auVar18._8_4_ * fVar244;
  auVar300._12_4_ = fVar212 * auVar16._12_4_ + fVar210 * auVar17._12_4_ + auVar18._12_4_ * fVar209;
  auVar300._16_4_ = fVar247 * auVar16._16_4_ + fVar245 * auVar17._16_4_ + auVar18._16_4_ * fVar231;
  auVar300._20_4_ = fVar211 * auVar16._20_4_ + fVar215 * auVar17._20_4_ + auVar18._20_4_ * fVar191;
  auVar300._24_4_ = fVar248 * auVar16._24_4_ + fVar246 * auVar17._24_4_ + auVar18._24_4_ * fVar244;
  auVar300._28_4_ = fVar210 + in_register_000015dc + in_register_0000159c;
  auVar222._0_4_ = fVar247 * auVar19._0_4_ + fVar245 * auVar20._0_4_ + auVar21._0_4_ * fVar231;
  auVar222._4_4_ = fVar211 * auVar19._4_4_ + fVar215 * auVar20._4_4_ + auVar21._4_4_ * fVar191;
  auVar222._8_4_ = fVar248 * auVar19._8_4_ + fVar246 * auVar20._8_4_ + auVar21._8_4_ * fVar244;
  auVar222._12_4_ = fVar212 * auVar19._12_4_ + fVar210 * auVar20._12_4_ + auVar21._12_4_ * fVar209;
  auVar222._16_4_ = fVar247 * auVar19._16_4_ + fVar245 * auVar20._16_4_ + auVar21._16_4_ * fVar231;
  auVar222._20_4_ = fVar211 * auVar19._20_4_ + fVar215 * auVar20._20_4_ + auVar21._20_4_ * fVar191;
  auVar222._24_4_ = fVar248 * auVar19._24_4_ + fVar246 * auVar20._24_4_ + auVar21._24_4_ * fVar244;
  auVar222._28_4_ = fVar212 + fVar210 + fVar209;
  auVar79 = vshufps_avx(auVar101,auVar101,0);
  auVar196 = vshufps_avx(auVar101,auVar101,0x55);
  auVar151 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar191 = auVar151._0_4_;
  fVar244 = auVar151._4_4_;
  fVar209 = auVar151._8_4_;
  fVar245 = auVar151._12_4_;
  fVar248 = auVar196._0_4_;
  fVar212 = auVar196._4_4_;
  fVar249 = auVar196._8_4_;
  fVar213 = auVar196._12_4_;
  fVar215 = auVar17._28_4_ + fVar245;
  fVar246 = auVar79._0_4_;
  fVar210 = auVar79._4_4_;
  fVar247 = auVar79._8_4_;
  fVar211 = auVar79._12_4_;
  fVar231 = auVar90._28_4_;
  auVar124._0_4_ = fVar246 * auVar90._0_4_ + fVar248 * auVar14._0_4_ + fVar191 * auVar15._0_4_;
  auVar124._4_4_ = fVar210 * auVar90._4_4_ + fVar212 * auVar14._4_4_ + fVar244 * auVar15._4_4_;
  auVar124._8_4_ = fVar247 * auVar90._8_4_ + fVar249 * auVar14._8_4_ + fVar209 * auVar15._8_4_;
  auVar124._12_4_ = fVar211 * auVar90._12_4_ + fVar213 * auVar14._12_4_ + fVar245 * auVar15._12_4_;
  auVar124._16_4_ = fVar246 * auVar90._16_4_ + fVar248 * auVar14._16_4_ + fVar191 * auVar15._16_4_;
  auVar124._20_4_ = fVar210 * auVar90._20_4_ + fVar212 * auVar14._20_4_ + fVar244 * auVar15._20_4_;
  auVar124._24_4_ = fVar247 * auVar90._24_4_ + fVar249 * auVar14._24_4_ + fVar209 * auVar15._24_4_;
  auVar124._28_4_ = fVar231 + auVar14._28_4_ + auVar15._28_4_;
  auVar154._0_4_ = fVar246 * auVar16._0_4_ + auVar18._0_4_ * fVar191 + fVar248 * auVar17._0_4_;
  auVar154._4_4_ = fVar210 * auVar16._4_4_ + auVar18._4_4_ * fVar244 + fVar212 * auVar17._4_4_;
  auVar154._8_4_ = fVar247 * auVar16._8_4_ + auVar18._8_4_ * fVar209 + fVar249 * auVar17._8_4_;
  auVar154._12_4_ = fVar211 * auVar16._12_4_ + auVar18._12_4_ * fVar245 + fVar213 * auVar17._12_4_;
  auVar154._16_4_ = fVar246 * auVar16._16_4_ + auVar18._16_4_ * fVar191 + fVar248 * auVar17._16_4_;
  auVar154._20_4_ = fVar210 * auVar16._20_4_ + auVar18._20_4_ * fVar244 + fVar212 * auVar17._20_4_;
  auVar154._24_4_ = fVar247 * auVar16._24_4_ + auVar18._24_4_ * fVar209 + fVar249 * auVar17._24_4_;
  auVar154._28_4_ = fVar231 + auVar18._28_4_ + auVar15._28_4_;
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  auVar186._16_4_ = 0x219392ef;
  auVar186._20_4_ = 0x219392ef;
  auVar186._24_4_ = 0x219392ef;
  auVar186._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar306,auVar170);
  auVar90 = vcmpps_avx(auVar90,auVar186,1);
  auVar14 = vblendvps_avx(auVar306,auVar186,auVar90);
  auVar90 = vandps_avx(auVar300,auVar170);
  auVar90 = vcmpps_avx(auVar90,auVar186,1);
  auVar15 = vblendvps_avx(auVar300,auVar186,auVar90);
  auVar90 = vandps_avx(auVar222,auVar170);
  auVar90 = vcmpps_avx(auVar90,auVar186,1);
  auVar90 = vblendvps_avx(auVar222,auVar186,auVar90);
  auVar171._0_4_ = fVar246 * auVar19._0_4_ + fVar248 * auVar20._0_4_ + auVar21._0_4_ * fVar191;
  auVar171._4_4_ = fVar210 * auVar19._4_4_ + fVar212 * auVar20._4_4_ + auVar21._4_4_ * fVar244;
  auVar171._8_4_ = fVar247 * auVar19._8_4_ + fVar249 * auVar20._8_4_ + auVar21._8_4_ * fVar209;
  auVar171._12_4_ = fVar211 * auVar19._12_4_ + fVar213 * auVar20._12_4_ + auVar21._12_4_ * fVar245;
  auVar171._16_4_ = fVar246 * auVar19._16_4_ + fVar248 * auVar20._16_4_ + auVar21._16_4_ * fVar191;
  auVar171._20_4_ = fVar210 * auVar19._20_4_ + fVar212 * auVar20._20_4_ + auVar21._20_4_ * fVar244;
  auVar171._24_4_ = fVar247 * auVar19._24_4_ + fVar249 * auVar20._24_4_ + auVar21._24_4_ * fVar209;
  auVar171._28_4_ = fVar231 + fVar215;
  auVar16 = vrcpps_avx(auVar14);
  fVar231 = auVar16._0_4_;
  fVar244 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar244;
  auVar17._0_4_ = auVar14._0_4_ * fVar231;
  fVar245 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar245;
  fVar246 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar246;
  fVar247 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar247;
  fVar248 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar248;
  fVar249 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar249;
  auVar17._28_4_ = fVar215;
  auVar275._8_4_ = 0x3f800000;
  auVar275._0_8_ = 0x3f8000003f800000;
  auVar275._12_4_ = 0x3f800000;
  auVar275._16_4_ = 0x3f800000;
  auVar275._20_4_ = 0x3f800000;
  auVar275._24_4_ = 0x3f800000;
  auVar275._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar275,auVar17);
  auVar14 = vrcpps_avx(auVar15);
  fVar231 = fVar231 + fVar231 * auVar17._0_4_;
  fVar244 = fVar244 + fVar244 * auVar17._4_4_;
  fVar245 = fVar245 + fVar245 * auVar17._8_4_;
  fVar246 = fVar246 + fVar246 * auVar17._12_4_;
  fVar247 = fVar247 + fVar247 * auVar17._16_4_;
  fVar248 = fVar248 + fVar248 * auVar17._20_4_;
  fVar249 = fVar249 + fVar249 * auVar17._24_4_;
  fVar191 = auVar14._0_4_;
  fVar209 = auVar14._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar209;
  auVar18._0_4_ = auVar15._0_4_ * fVar191;
  fVar215 = auVar14._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar215;
  fVar210 = auVar14._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar210;
  fVar211 = auVar14._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar211;
  fVar212 = auVar14._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar212;
  fVar213 = auVar14._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar213;
  auVar18._28_4_ = auVar16._28_4_;
  auVar14 = vsubps_avx(auVar275,auVar18);
  fVar191 = fVar191 + fVar191 * auVar14._0_4_;
  fVar209 = fVar209 + fVar209 * auVar14._4_4_;
  fVar215 = fVar215 + fVar215 * auVar14._8_4_;
  fVar210 = fVar210 + fVar210 * auVar14._12_4_;
  fVar211 = fVar211 + fVar211 * auVar14._16_4_;
  fVar212 = fVar212 + fVar212 * auVar14._20_4_;
  fVar213 = fVar213 + fVar213 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar90);
  fVar216 = auVar14._0_4_;
  fVar224 = auVar14._4_4_;
  auVar15._4_4_ = fVar224 * auVar90._4_4_;
  auVar15._0_4_ = fVar216 * auVar90._0_4_;
  fVar225 = auVar14._8_4_;
  auVar15._8_4_ = fVar225 * auVar90._8_4_;
  fVar226 = auVar14._12_4_;
  auVar15._12_4_ = fVar226 * auVar90._12_4_;
  fVar227 = auVar14._16_4_;
  auVar15._16_4_ = fVar227 * auVar90._16_4_;
  fVar229 = auVar14._20_4_;
  auVar15._20_4_ = fVar229 * auVar90._20_4_;
  fVar230 = auVar14._24_4_;
  auVar15._24_4_ = fVar230 * auVar90._24_4_;
  auVar15._28_4_ = auVar90._28_4_;
  auVar90 = vsubps_avx(auVar275,auVar15);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar66 * 7 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar196);
  fVar216 = fVar216 + fVar216 * auVar90._0_4_;
  fVar224 = fVar224 + fVar224 * auVar90._4_4_;
  fVar225 = fVar225 + fVar225 * auVar90._8_4_;
  fVar226 = fVar226 + fVar226 * auVar90._12_4_;
  fVar227 = fVar227 + fVar227 * auVar90._16_4_;
  fVar229 = fVar229 + fVar229 * auVar90._20_4_;
  fVar230 = fVar230 + fVar230 * auVar90._24_4_;
  auVar91._16_16_ = auVar196;
  auVar91._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar90 = vsubps_avx(auVar90,auVar124);
  auVar74._0_4_ = fVar231 * auVar90._0_4_;
  auVar74._4_4_ = fVar244 * auVar90._4_4_;
  auVar74._8_4_ = fVar245 * auVar90._8_4_;
  auVar74._12_4_ = fVar246 * auVar90._12_4_;
  auVar16._16_4_ = fVar247 * auVar90._16_4_;
  auVar16._0_16_ = auVar74;
  auVar16._20_4_ = fVar248 * auVar90._20_4_;
  auVar16._24_4_ = fVar249 * auVar90._24_4_;
  auVar16._28_4_ = auVar90._28_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar79 = vpmovsxwd_avx(auVar151);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar66 * 9 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar4);
  auVar187._16_16_ = auVar196;
  auVar187._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar187);
  auVar90 = vsubps_avx(auVar90,auVar124);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 6);
  auVar79 = vpmovsxwd_avx(auVar296);
  auVar102._0_4_ = fVar231 * auVar90._0_4_;
  auVar102._4_4_ = fVar244 * auVar90._4_4_;
  auVar102._8_4_ = fVar245 * auVar90._8_4_;
  auVar102._12_4_ = fVar246 * auVar90._12_4_;
  auVar19._16_4_ = fVar247 * auVar90._16_4_;
  auVar19._0_16_ = auVar102;
  auVar19._20_4_ = fVar248 * auVar90._20_4_;
  auVar19._24_4_ = fVar249 * auVar90._24_4_;
  auVar19._28_4_ = auVar90._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 0xe);
  auVar196 = vpmovsxwd_avx(auVar5);
  auVar188._16_16_ = auVar196;
  auVar188._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar188);
  auVar90 = vsubps_avx(auVar90,auVar154);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar79 = vpmovsxwd_avx(auVar119);
  auVar174._0_4_ = fVar191 * auVar90._0_4_;
  auVar174._4_4_ = fVar209 * auVar90._4_4_;
  auVar174._8_4_ = fVar215 * auVar90._8_4_;
  auVar174._12_4_ = fVar210 * auVar90._12_4_;
  auVar20._16_4_ = fVar211 * auVar90._16_4_;
  auVar20._0_16_ = auVar174;
  auVar20._20_4_ = fVar212 * auVar90._20_4_;
  auVar20._24_4_ = fVar213 * auVar90._24_4_;
  auVar20._28_4_ = auVar90._28_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar107);
  auVar241._16_16_ = auVar196;
  auVar241._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar241);
  auVar90 = vsubps_avx(auVar90,auVar154);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 6);
  auVar79 = vpmovsxwd_avx(auVar137);
  auVar133._0_4_ = fVar191 * auVar90._0_4_;
  auVar133._4_4_ = fVar209 * auVar90._4_4_;
  auVar133._8_4_ = fVar215 * auVar90._8_4_;
  auVar133._12_4_ = fVar210 * auVar90._12_4_;
  auVar21._16_4_ = fVar211 * auVar90._16_4_;
  auVar21._0_16_ = auVar133;
  auVar21._20_4_ = fVar212 * auVar90._20_4_;
  auVar21._24_4_ = fVar213 * auVar90._24_4_;
  auVar21._28_4_ = auVar90._28_4_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar108);
  auVar206._16_16_ = auVar196;
  auVar206._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar206);
  auVar90 = vsubps_avx(auVar90,auVar171);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar79 = vpmovsxwd_avx(auVar228);
  auVar192._0_4_ = fVar216 * auVar90._0_4_;
  auVar192._4_4_ = fVar224 * auVar90._4_4_;
  auVar192._8_4_ = fVar225 * auVar90._8_4_;
  auVar192._12_4_ = fVar226 * auVar90._12_4_;
  auVar22._16_4_ = fVar227 * auVar90._16_4_;
  auVar22._0_16_ = auVar192;
  auVar22._20_4_ = fVar229 * auVar90._20_4_;
  auVar22._24_4_ = fVar230 * auVar90._24_4_;
  auVar22._28_4_ = auVar90._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar6);
  auVar242._16_16_ = auVar196;
  auVar242._0_16_ = auVar79;
  auVar90 = vcvtdq2ps_avx(auVar242);
  auVar90 = vsubps_avx(auVar90,auVar171);
  auVar159._0_4_ = fVar216 * auVar90._0_4_;
  auVar159._4_4_ = fVar224 * auVar90._4_4_;
  auVar159._8_4_ = fVar225 * auVar90._8_4_;
  auVar159._12_4_ = fVar226 * auVar90._12_4_;
  auVar23._16_4_ = fVar227 * auVar90._16_4_;
  auVar23._0_16_ = auVar159;
  auVar23._20_4_ = fVar229 * auVar90._20_4_;
  auVar23._24_4_ = fVar230 * auVar90._24_4_;
  auVar23._28_4_ = auVar90._28_4_;
  auVar79 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar196 = vpminsd_avx(auVar74,auVar102);
  auVar292._16_16_ = auVar79;
  auVar292._0_16_ = auVar196;
  auVar79 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar196 = vpminsd_avx(auVar174,auVar133);
  auVar301._16_16_ = auVar79;
  auVar301._0_16_ = auVar196;
  auVar90 = vmaxps_avx(auVar292,auVar301);
  auVar79 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar196 = vpminsd_avx(auVar192,auVar159);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar330._4_4_ = uVar71;
  auVar330._0_4_ = uVar71;
  auVar330._8_4_ = uVar71;
  auVar330._12_4_ = uVar71;
  auVar330._16_4_ = uVar71;
  auVar330._20_4_ = uVar71;
  auVar330._24_4_ = uVar71;
  auVar330._28_4_ = uVar71;
  auVar316._16_16_ = auVar79;
  auVar316._0_16_ = auVar196;
  auVar14 = vmaxps_avx(auVar316,auVar330);
  auVar90 = vmaxps_avx(auVar90,auVar14);
  local_300._4_4_ = auVar90._4_4_ * 0.99999964;
  local_300._0_4_ = auVar90._0_4_ * 0.99999964;
  local_300._8_4_ = auVar90._8_4_ * 0.99999964;
  local_300._12_4_ = auVar90._12_4_ * 0.99999964;
  local_300._16_4_ = auVar90._16_4_ * 0.99999964;
  local_300._20_4_ = auVar90._20_4_ * 0.99999964;
  local_300._24_4_ = auVar90._24_4_ * 0.99999964;
  local_300._28_4_ = auVar90._28_4_;
  auVar79 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
  auVar196 = vpmaxsd_avx(auVar74,auVar102);
  auVar92._16_16_ = auVar79;
  auVar92._0_16_ = auVar196;
  auVar79 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar196 = vpmaxsd_avx(auVar174,auVar133);
  auVar125._16_16_ = auVar79;
  auVar125._0_16_ = auVar196;
  auVar90 = vminps_avx(auVar92,auVar125);
  auVar79 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar196 = vpmaxsd_avx(auVar192,auVar159);
  auVar126._16_16_ = auVar79;
  auVar126._0_16_ = auVar196;
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar155._4_4_ = uVar71;
  auVar155._0_4_ = uVar71;
  auVar155._8_4_ = uVar71;
  auVar155._12_4_ = uVar71;
  auVar155._16_4_ = uVar71;
  auVar155._20_4_ = uVar71;
  auVar155._24_4_ = uVar71;
  auVar155._28_4_ = uVar71;
  auVar14 = vminps_avx(auVar126,auVar155);
  auVar90 = vminps_avx(auVar90,auVar14);
  auVar14._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar90._28_4_;
  auVar90 = vcmpps_avx(local_300,auVar14,2);
  auVar79 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar127._16_16_ = auVar79;
  auVar127._0_16_ = auVar79;
  auVar14 = vcvtdq2ps_avx(auVar127);
  auVar14 = vcmpps_avx(_DAT_01f7b060,auVar14,1);
  auVar90 = vandps_avx(auVar90,auVar14);
  uVar71 = vmovmskps_avx(auVar90);
  uVar66 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar71);
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  uVar63 = 1 << ((byte)k & 0x1f);
LAB_00a2a0f0:
  if (uVar66 == 0) {
LAB_00a2c074:
    return uVar66 != 0;
  }
  lVar67 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar65].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar67 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var11 + uVar70 * (long)pvVar10);
  fVar231 = *pfVar1;
  fVar191 = pfVar1[1];
  fVar244 = pfVar1[2];
  fVar209 = pfVar1[3];
  auVar79 = *(undefined1 (*) [16])(_Var11 + (uVar70 + 1) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (uVar70 + 2) * (long)pvVar10);
  fVar245 = *pfVar1;
  fVar215 = pfVar1[1];
  fVar246 = pfVar1[2];
  fVar210 = pfVar1[3];
  auVar196 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar70 + 3));
  lVar12 = *(long *)&pGVar8[1].time_range.upper;
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * uVar70);
  fVar247 = *pfVar1;
  fVar211 = pfVar1[1];
  fVar248 = pfVar1[2];
  fVar212 = pfVar1[3];
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar70 + 1));
  fVar249 = *pfVar1;
  fVar213 = pfVar1[1];
  fVar216 = pfVar1[2];
  fVar224 = pfVar1[3];
  uVar73 = uVar66 - 1 & uVar66;
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar70 + 2));
  fVar225 = *pfVar1;
  fVar226 = pfVar1[1];
  fVar227 = pfVar1[2];
  fVar229 = pfVar1[3];
  lVar13 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar12 + (long)p_Var9 * (uVar70 + 3));
  fVar230 = *pfVar1;
  fVar214 = pfVar1[1];
  fVar250 = pfVar1[2];
  fVar251 = pfVar1[3];
  if (((uVar73 != 0) && (uVar70 = uVar73 - 1 & uVar73, uVar70 != 0)) && (lVar12 = 0, uVar70 != 0)) {
    for (; (uVar70 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  auVar151 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar151 = vinsertps_avx(auVar151,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar103._0_4_ = fVar249 * 0.0 + fVar225 * 0.5 + fVar230 * 0.0;
  auVar103._4_4_ = fVar213 * 0.0 + fVar226 * 0.5 + fVar214 * 0.0;
  auVar103._8_4_ = fVar216 * 0.0 + fVar227 * 0.5 + fVar250 * 0.0;
  auVar103._12_4_ = fVar224 * 0.0 + fVar229 * 0.5 + fVar251 * 0.0;
  auVar294._0_4_ = fVar247 * 0.5;
  auVar294._4_4_ = fVar211 * 0.5;
  auVar294._8_4_ = fVar248 * 0.5;
  auVar294._12_4_ = fVar212 * 0.5;
  auVar137 = vsubps_avx(auVar103,auVar294);
  fVar173 = auVar196._0_4_;
  fVar261 = auVar196._4_4_;
  fVar303 = auVar196._8_4_;
  fVar262 = auVar196._12_4_;
  fVar307 = auVar79._0_4_;
  fVar263 = auVar79._4_4_;
  fVar308 = auVar79._8_4_;
  fVar264 = auVar79._12_4_;
  auVar295._0_4_ = fVar307 * 0.0 + fVar245 * 0.5 + fVar173 * 0.0;
  auVar295._4_4_ = fVar263 * 0.0 + fVar215 * 0.5 + fVar261 * 0.0;
  auVar295._8_4_ = fVar308 * 0.0 + fVar246 * 0.5 + fVar303 * 0.0;
  auVar295._12_4_ = fVar264 * 0.0 + fVar210 * 0.5 + fVar262 * 0.0;
  auVar326._0_4_ = fVar231 * 0.5;
  auVar326._4_4_ = fVar191 * 0.5;
  auVar326._8_4_ = fVar244 * 0.5;
  auVar326._12_4_ = fVar209 * 0.5;
  auVar296 = vsubps_avx(auVar295,auVar326);
  auVar327._0_4_ = fVar249 + fVar225 * 0.0 + fVar230 * -0.0 + fVar247 * -0.0;
  auVar327._4_4_ = fVar213 + fVar226 * 0.0 + fVar214 * -0.0 + fVar211 * -0.0;
  auVar327._8_4_ = fVar216 + fVar227 * 0.0 + fVar250 * -0.0 + fVar248 * -0.0;
  auVar327._12_4_ = fVar224 + fVar229 * 0.0 + fVar251 * -0.0 + fVar212 * -0.0;
  local_720._0_4_ = fVar247 * -0.0 + fVar249 * 0.0 + fVar225 + fVar230 * -0.0;
  local_720._4_4_ = fVar211 * -0.0 + fVar213 * 0.0 + fVar226 + fVar214 * -0.0;
  fStack_718 = fVar248 * -0.0 + fVar216 * 0.0 + fVar227 + fVar250 * -0.0;
  fStack_714 = fVar212 * -0.0 + fVar224 * 0.0 + fVar229 + fVar251 * -0.0;
  auVar284._0_4_ = fVar225 * 0.0 + fVar230 * 0.5;
  auVar284._4_4_ = fVar226 * 0.0 + fVar214 * 0.5;
  auVar284._8_4_ = fVar227 * 0.0 + fVar250 * 0.5;
  auVar284._12_4_ = fVar229 * 0.0 + fVar251 * 0.5;
  auVar266._0_4_ = fVar249 * 0.5;
  auVar266._4_4_ = fVar213 * 0.5;
  auVar266._8_4_ = fVar216 * 0.5;
  auVar266._12_4_ = fVar224 * 0.5;
  auVar79 = vsubps_avx(auVar284,auVar266);
  auVar304._0_4_ = fVar231 * -0.0 + fVar173 * -0.0 + fVar245 * 0.0 + fVar307;
  auVar304._4_4_ = fVar191 * -0.0 + fVar261 * -0.0 + fVar215 * 0.0 + fVar263;
  auVar304._8_4_ = fVar244 * -0.0 + fVar303 * -0.0 + fVar246 * 0.0 + fVar308;
  auVar304._12_4_ = fVar209 * -0.0 + fVar262 * -0.0 + fVar210 * 0.0 + fVar264;
  auVar218._0_4_ = auVar79._0_4_ + fVar247 * 0.0;
  auVar218._4_4_ = auVar79._4_4_ + fVar211 * 0.0;
  auVar218._8_4_ = auVar79._8_4_ + fVar248 * 0.0;
  auVar218._12_4_ = auVar79._12_4_ + fVar212 * 0.0;
  auVar267._0_4_ = fVar231 * -0.0 + fVar307 * 0.0 + fVar245 + fVar173 * -0.0;
  auVar267._4_4_ = fVar191 * -0.0 + fVar263 * 0.0 + fVar215 + fVar261 * -0.0;
  auVar267._8_4_ = fVar244 * -0.0 + fVar308 * 0.0 + fVar246 + fVar303 * -0.0;
  auVar267._12_4_ = fVar209 * -0.0 + fVar264 * 0.0 + fVar210 + fVar262 * -0.0;
  auVar160._0_4_ = fVar245 * 0.0 + fVar173 * 0.5;
  auVar160._4_4_ = fVar215 * 0.0 + fVar261 * 0.5;
  auVar160._8_4_ = fVar246 * 0.0 + fVar303 * 0.5;
  auVar160._12_4_ = fVar210 * 0.0 + fVar262 * 0.5;
  auVar193._0_4_ = fVar307 * 0.5;
  auVar193._4_4_ = fVar263 * 0.5;
  auVar193._8_4_ = fVar308 * 0.5;
  auVar193._12_4_ = fVar264 * 0.5;
  auVar79 = vsubps_avx(auVar160,auVar193);
  auVar194._0_4_ = fVar231 * 0.0 + auVar79._0_4_;
  auVar194._4_4_ = fVar191 * 0.0 + auVar79._4_4_;
  auVar194._8_4_ = fVar244 * 0.0 + auVar79._8_4_;
  auVar194._12_4_ = fVar209 * 0.0 + auVar79._12_4_;
  auVar79 = vshufps_avx(auVar137,auVar137,0xc9);
  auVar196 = vshufps_avx(auVar304,auVar304,0xc9);
  fVar249 = auVar137._0_4_;
  auVar232._0_4_ = fVar249 * auVar196._0_4_;
  fVar216 = auVar137._4_4_;
  auVar232._4_4_ = fVar216 * auVar196._4_4_;
  fVar225 = auVar137._8_4_;
  auVar232._8_4_ = fVar225 * auVar196._8_4_;
  fVar226 = auVar137._12_4_;
  auVar232._12_4_ = fVar226 * auVar196._12_4_;
  auVar252._0_4_ = auVar304._0_4_ * auVar79._0_4_;
  auVar252._4_4_ = auVar304._4_4_ * auVar79._4_4_;
  auVar252._8_4_ = auVar304._8_4_ * auVar79._8_4_;
  auVar252._12_4_ = auVar304._12_4_ * auVar79._12_4_;
  auVar196 = vsubps_avx(auVar252,auVar232);
  auVar4 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar196 = vshufps_avx(auVar296,auVar296,0xc9);
  auVar233._0_4_ = fVar249 * auVar196._0_4_;
  auVar233._4_4_ = fVar216 * auVar196._4_4_;
  auVar233._8_4_ = fVar225 * auVar196._8_4_;
  auVar233._12_4_ = fVar226 * auVar196._12_4_;
  auVar161._0_4_ = auVar296._0_4_ * auVar79._0_4_;
  auVar161._4_4_ = auVar296._4_4_ * auVar79._4_4_;
  auVar161._8_4_ = auVar296._8_4_ * auVar79._8_4_;
  auVar161._12_4_ = auVar296._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar161,auVar233);
  auVar296 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar196 = vshufps_avx(auVar218,auVar218,0xc9);
  auVar79 = vshufps_avx(auVar267,auVar267,0xc9);
  auVar162._0_4_ = auVar218._0_4_ * auVar79._0_4_;
  auVar162._4_4_ = auVar218._4_4_ * auVar79._4_4_;
  auVar162._8_4_ = auVar218._8_4_ * auVar79._8_4_;
  auVar162._12_4_ = auVar218._12_4_ * auVar79._12_4_;
  auVar268._0_4_ = auVar267._0_4_ * auVar196._0_4_;
  auVar268._4_4_ = auVar267._4_4_ * auVar196._4_4_;
  auVar268._8_4_ = auVar267._8_4_ * auVar196._8_4_;
  auVar268._12_4_ = auVar267._12_4_ * auVar196._12_4_;
  auVar79 = vsubps_avx(auVar268,auVar162);
  auVar5 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar79 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar269._0_4_ = auVar79._0_4_ * auVar218._0_4_;
  auVar269._4_4_ = auVar79._4_4_ * auVar218._4_4_;
  auVar269._8_4_ = auVar79._8_4_ * auVar218._8_4_;
  auVar269._12_4_ = auVar79._12_4_ * auVar218._12_4_;
  auVar79 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar195._0_4_ = auVar196._0_4_ * auVar194._0_4_;
  auVar195._4_4_ = auVar196._4_4_ * auVar194._4_4_;
  auVar195._8_4_ = auVar196._8_4_ * auVar194._8_4_;
  auVar195._12_4_ = auVar196._12_4_ * auVar194._12_4_;
  auVar196 = vsubps_avx(auVar195,auVar269);
  auVar119 = vshufps_avx(auVar196,auVar196,0xc9);
  fVar245 = auVar79._0_4_;
  auVar228 = ZEXT416((uint)fVar245);
  auVar196 = vrsqrtss_avx(auVar228,auVar228);
  fVar231 = auVar196._0_4_;
  auVar196 = ZEXT416((uint)(fVar231 * 1.5 - fVar245 * 0.5 * fVar231 * fVar231 * fVar231));
  auVar107 = vshufps_avx(auVar196,auVar196,0);
  auVar196 = vdpps_avx(auVar4,auVar296,0x7f);
  fVar231 = auVar4._0_4_ * auVar107._0_4_;
  fVar191 = auVar4._4_4_ * auVar107._4_4_;
  fVar244 = auVar4._8_4_ * auVar107._8_4_;
  fVar209 = auVar4._12_4_ * auVar107._12_4_;
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar285._0_4_ = auVar296._0_4_ * auVar79._0_4_;
  auVar285._4_4_ = auVar296._4_4_ * auVar79._4_4_;
  auVar285._8_4_ = auVar296._8_4_ * auVar79._8_4_;
  auVar285._12_4_ = auVar296._12_4_ * auVar79._12_4_;
  auVar79 = vshufps_avx(auVar196,auVar196,0);
  auVar253._0_4_ = auVar4._0_4_ * auVar79._0_4_;
  auVar253._4_4_ = auVar4._4_4_ * auVar79._4_4_;
  auVar253._8_4_ = auVar4._8_4_ * auVar79._8_4_;
  auVar253._12_4_ = auVar4._12_4_ * auVar79._12_4_;
  auVar108 = vsubps_avx(auVar285,auVar253);
  auVar79 = vrcpss_avx(auVar228,auVar228);
  auVar79 = ZEXT416((uint)(auVar79._0_4_ * (2.0 - fVar245 * auVar79._0_4_)));
  auVar4 = vshufps_avx(auVar79,auVar79,0);
  auVar79 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar245 = auVar79._0_4_;
  auVar228 = ZEXT416((uint)fVar245);
  auVar196 = vrsqrtss_avx(auVar228,auVar228);
  fVar215 = auVar196._0_4_;
  auVar196 = vdpps_avx(auVar5,auVar119,0x7f);
  auVar296 = ZEXT416((uint)(fVar215 * 1.5 - fVar245 * 0.5 * fVar215 * fVar215 * fVar215));
  auVar296 = vshufps_avx(auVar296,auVar296,0);
  fVar215 = auVar296._0_4_ * auVar5._0_4_;
  fVar246 = auVar296._4_4_ * auVar5._4_4_;
  fVar210 = auVar296._8_4_ * auVar5._8_4_;
  fVar247 = auVar296._12_4_ * auVar5._12_4_;
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar234._0_4_ = auVar79._0_4_ * auVar119._0_4_;
  auVar234._4_4_ = auVar79._4_4_ * auVar119._4_4_;
  auVar234._8_4_ = auVar79._8_4_ * auVar119._8_4_;
  auVar234._12_4_ = auVar79._12_4_ * auVar119._12_4_;
  auVar79 = vshufps_avx(auVar196,auVar196,0);
  auVar163._0_4_ = auVar79._0_4_ * auVar5._0_4_;
  auVar163._4_4_ = auVar79._4_4_ * auVar5._4_4_;
  auVar163._8_4_ = auVar79._8_4_ * auVar5._8_4_;
  auVar163._12_4_ = auVar79._12_4_ * auVar5._12_4_;
  auVar119 = vsubps_avx(auVar234,auVar163);
  auVar79 = vrcpss_avx(auVar228,auVar228);
  auVar79 = ZEXT416((uint)((2.0 - fVar245 * auVar79._0_4_) * auVar79._0_4_));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar196 = vshufps_avx(auVar327,auVar327,0xff);
  auVar270._0_4_ = auVar196._0_4_ * fVar231;
  auVar270._4_4_ = auVar196._4_4_ * fVar191;
  auVar270._8_4_ = auVar196._8_4_ * fVar244;
  auVar270._12_4_ = auVar196._12_4_ * fVar209;
  _local_4e0 = vsubps_avx(auVar327,auVar270);
  auVar5 = vshufps_avx(auVar137,auVar137,0xff);
  auVar197._0_4_ =
       auVar5._0_4_ * fVar231 + auVar107._0_4_ * auVar108._0_4_ * auVar4._0_4_ * auVar196._0_4_;
  auVar197._4_4_ =
       auVar5._4_4_ * fVar191 + auVar107._4_4_ * auVar108._4_4_ * auVar4._4_4_ * auVar196._4_4_;
  auVar197._8_4_ =
       auVar5._8_4_ * fVar244 + auVar107._8_4_ * auVar108._8_4_ * auVar4._8_4_ * auVar196._8_4_;
  auVar197._12_4_ =
       auVar5._12_4_ * fVar209 + auVar107._12_4_ * auVar108._12_4_ * auVar4._12_4_ * auVar196._12_4_
  ;
  auVar5 = vsubps_avx(auVar137,auVar197);
  local_4f0._0_4_ = auVar327._0_4_ + auVar270._0_4_;
  local_4f0._4_4_ = auVar327._4_4_ + auVar270._4_4_;
  fStack_4e8 = auVar327._8_4_ + auVar270._8_4_;
  fStack_4e4 = auVar327._12_4_ + auVar270._12_4_;
  auVar196 = vshufps_avx(_local_720,_local_720,0xff);
  auVar175._0_4_ = fVar215 * auVar196._0_4_;
  auVar175._4_4_ = fVar246 * auVar196._4_4_;
  auVar175._8_4_ = fVar210 * auVar196._8_4_;
  auVar175._12_4_ = fVar247 * auVar196._12_4_;
  _local_500 = vsubps_avx(_local_720,auVar175);
  auVar4 = vshufps_avx(auVar218,auVar218,0xff);
  auVar104._0_4_ =
       fVar215 * auVar4._0_4_ + auVar196._0_4_ * auVar296._0_4_ * auVar119._0_4_ * auVar79._0_4_;
  auVar104._4_4_ =
       fVar246 * auVar4._4_4_ + auVar196._4_4_ * auVar296._4_4_ * auVar119._4_4_ * auVar79._4_4_;
  auVar104._8_4_ =
       fVar210 * auVar4._8_4_ + auVar196._8_4_ * auVar296._8_4_ * auVar119._8_4_ * auVar79._8_4_;
  auVar104._12_4_ =
       fVar247 * auVar4._12_4_ +
       auVar196._12_4_ * auVar296._12_4_ * auVar119._12_4_ * auVar79._12_4_;
  auVar296 = vsubps_avx(auVar218,auVar104);
  local_510._0_4_ = (float)local_720._0_4_ + auVar175._0_4_;
  local_510._4_4_ = (float)local_720._4_4_ + auVar175._4_4_;
  fStack_508 = fStack_718 + auVar175._8_4_;
  fStack_504 = fStack_714 + auVar175._12_4_;
  local_520._0_4_ = local_4e0._0_4_ + auVar5._0_4_ * 0.33333334;
  local_520._4_4_ = local_4e0._4_4_ + auVar5._4_4_ * 0.33333334;
  fStack_518 = local_4e0._8_4_ + auVar5._8_4_ * 0.33333334;
  fStack_514 = local_4e0._12_4_ + auVar5._12_4_ * 0.33333334;
  local_3c0 = vsubps_avx(_local_4e0,auVar151);
  auVar196 = vmovsldup_avx(local_3c0);
  auVar79 = vmovshdup_avx(local_3c0);
  auVar4 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar231 = pre->ray_space[k].vx.field_0.m128[0];
  fVar191 = pre->ray_space[k].vx.field_0.m128[1];
  fVar244 = pre->ray_space[k].vx.field_0.m128[2];
  fVar209 = pre->ray_space[k].vx.field_0.m128[3];
  fVar245 = pre->ray_space[k].vy.field_0.m128[0];
  fVar215 = pre->ray_space[k].vy.field_0.m128[1];
  fVar246 = pre->ray_space[k].vy.field_0.m128[2];
  fVar210 = pre->ray_space[k].vy.field_0.m128[3];
  fVar247 = pre->ray_space[k].vz.field_0.m128[0];
  fVar211 = pre->ray_space[k].vz.field_0.m128[1];
  fVar248 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  fVar227 = fVar231 * auVar196._0_4_ + auVar4._0_4_ * fVar247 + fVar245 * auVar79._0_4_;
  fVar229 = fVar191 * auVar196._4_4_ + auVar4._4_4_ * fVar211 + fVar215 * auVar79._4_4_;
  local_720._4_4_ = fVar229;
  local_720._0_4_ = fVar227;
  fStack_718 = fVar244 * auVar196._8_4_ + auVar4._8_4_ * fVar248 + fVar246 * auVar79._8_4_;
  fStack_714 = fVar209 * auVar196._12_4_ + auVar4._12_4_ * fVar212 + fVar210 * auVar79._12_4_;
  local_3d0 = vsubps_avx(_local_520,auVar151);
  auVar4 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar79 = vmovshdup_avx(local_3d0);
  auVar196 = vmovsldup_avx(local_3d0);
  fVar213 = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + fVar247 * auVar4._0_4_;
  fVar224 = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + fVar211 * auVar4._4_4_;
  local_690._4_4_ = fVar224;
  local_690._0_4_ = fVar213;
  fStack_688 = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + fVar248 * auVar4._8_4_;
  fStack_684 = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar4._12_4_;
  auVar198._0_4_ = auVar296._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar296._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar296._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar296._12_4_ * 0.33333334;
  _local_530 = vsubps_avx(_local_500,auVar198);
  local_3e0 = vsubps_avx(_local_530,auVar151);
  auVar4 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar79 = vmovshdup_avx(local_3e0);
  auVar196 = vmovsldup_avx(local_3e0);
  auVar318._0_4_ = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + fVar247 * auVar4._0_4_;
  auVar318._4_4_ = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + fVar211 * auVar4._4_4_;
  auVar318._8_4_ = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + fVar248 * auVar4._8_4_;
  auVar318._12_4_ = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar4._12_4_;
  local_3f0 = vsubps_avx(_local_500,auVar151);
  auVar4 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar79 = vmovshdup_avx(local_3f0);
  auVar196 = vmovsldup_avx(local_3f0);
  auVar314._0_4_ = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + auVar4._0_4_ * fVar247;
  auVar314._4_4_ = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + auVar4._4_4_ * fVar211;
  auVar314._8_4_ = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + auVar4._8_4_ * fVar248;
  auVar314._12_4_ = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar4._12_4_ * fVar212;
  local_400 = vsubps_avx(_local_4f0,auVar151);
  auVar4 = vshufps_avx(local_400,local_400,0xaa);
  auVar79 = vmovshdup_avx(local_400);
  auVar196 = vmovsldup_avx(local_400);
  auVar286._0_4_ = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + auVar4._0_4_ * fVar247;
  auVar286._4_4_ = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + auVar4._4_4_ * fVar211;
  auVar286._8_4_ = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + auVar4._8_4_ * fVar248;
  auVar286._12_4_ = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar4._12_4_ * fVar212;
  local_540._0_4_ = (float)local_4f0._0_4_ + (fVar249 + auVar197._0_4_) * 0.33333334;
  local_540._4_4_ = (float)local_4f0._4_4_ + (fVar216 + auVar197._4_4_) * 0.33333334;
  fStack_538 = fStack_4e8 + (fVar225 + auVar197._8_4_) * 0.33333334;
  fStack_534 = fStack_4e4 + (fVar226 + auVar197._12_4_) * 0.33333334;
  local_410 = vsubps_avx(_local_540,auVar151);
  auVar4 = vshufps_avx(local_410,local_410,0xaa);
  auVar79 = vmovshdup_avx(local_410);
  auVar196 = vmovsldup_avx(local_410);
  auVar254._0_4_ = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + auVar4._0_4_ * fVar247;
  auVar254._4_4_ = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + auVar4._4_4_ * fVar211;
  auVar254._8_4_ = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + auVar4._8_4_ * fVar248;
  auVar254._12_4_ = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + auVar4._12_4_ * fVar212;
  auVar235._0_4_ = (auVar218._0_4_ + auVar104._0_4_) * 0.33333334;
  auVar235._4_4_ = (auVar218._4_4_ + auVar104._4_4_) * 0.33333334;
  auVar235._8_4_ = (auVar218._8_4_ + auVar104._8_4_) * 0.33333334;
  auVar235._12_4_ = (auVar218._12_4_ + auVar104._12_4_) * 0.33333334;
  _local_450 = vsubps_avx(_local_510,auVar235);
  local_420 = vsubps_avx(_local_450,auVar151);
  auVar4 = vshufps_avx(local_420,local_420,0xaa);
  auVar79 = vmovshdup_avx(local_420);
  auVar196 = vmovsldup_avx(local_420);
  auVar236._0_4_ = auVar196._0_4_ * fVar231 + auVar79._0_4_ * fVar245 + fVar247 * auVar4._0_4_;
  auVar236._4_4_ = auVar196._4_4_ * fVar191 + auVar79._4_4_ * fVar215 + fVar211 * auVar4._4_4_;
  auVar236._8_4_ = auVar196._8_4_ * fVar244 + auVar79._8_4_ * fVar246 + fVar248 * auVar4._8_4_;
  auVar236._12_4_ = auVar196._12_4_ * fVar209 + auVar79._12_4_ * fVar210 + fVar212 * auVar4._12_4_;
  local_430 = vsubps_avx(_local_510,auVar151);
  auVar151 = vshufps_avx(local_430,local_430,0xaa);
  auVar79 = vmovshdup_avx(local_430);
  auVar196 = vmovsldup_avx(local_430);
  auVar271._0_4_ = fVar231 * auVar196._0_4_ + fVar245 * auVar79._0_4_ + fVar247 * auVar151._0_4_;
  auVar271._4_4_ = fVar191 * auVar196._4_4_ + fVar215 * auVar79._4_4_ + fVar211 * auVar151._4_4_;
  auVar271._8_4_ = fVar244 * auVar196._8_4_ + fVar246 * auVar79._8_4_ + fVar248 * auVar151._8_4_;
  auVar271._12_4_ = fVar209 * auVar196._12_4_ + fVar210 * auVar79._12_4_ + fVar212 * auVar151._12_4_
  ;
  auVar4 = vmovlhps_avx(_local_720,auVar286);
  auVar296 = vmovlhps_avx(_local_690,auVar254);
  auVar5 = vmovlhps_avx(auVar318,auVar236);
  _local_3a0 = vmovlhps_avx(auVar314,auVar271);
  auVar79 = vminps_avx(auVar4,auVar296);
  auVar196 = vminps_avx(auVar5,_local_3a0);
  auVar151 = vminps_avx(auVar79,auVar196);
  auVar79 = vmaxps_avx(auVar4,auVar296);
  auVar196 = vmaxps_avx(auVar5,_local_3a0);
  auVar79 = vmaxps_avx(auVar79,auVar196);
  auVar196 = vshufpd_avx(auVar151,auVar151,3);
  auVar151 = vminps_avx(auVar151,auVar196);
  auVar196 = vshufpd_avx(auVar79,auVar79,3);
  auVar196 = vmaxps_avx(auVar79,auVar196);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar151,auVar219);
  auVar196 = vandps_avx(auVar196,auVar219);
  auVar79 = vmaxps_avx(auVar79,auVar196);
  auVar196 = vmovshdup_avx(auVar79);
  auVar79 = vmaxss_avx(auVar196,auVar79);
  fVar231 = auVar79._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar231);
  auVar79 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
  local_1c0._16_16_ = auVar79;
  local_1c0._0_16_ = auVar79;
  auVar75._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
  auVar75._8_4_ = auVar79._8_4_ ^ 0x80000000;
  auVar75._12_4_ = auVar79._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar75;
  local_1e0._0_16_ = auVar75;
  auVar79 = vpshufd_avx(ZEXT416(uVar65),0);
  local_320._16_16_ = auVar79;
  local_320._0_16_ = auVar79;
  auVar79 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar67 * 4 + 6)),0);
  local_340._16_16_ = auVar79;
  local_340._0_16_ = auVar79;
  bVar72 = false;
  uVar70 = 0;
  fVar231 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar296,auVar4);
  _local_380 = vsubps_avx(auVar5,auVar296);
  _local_390 = vsubps_avx(_local_3a0,auVar5);
  _local_460 = vsubps_avx(_local_4f0,_local_4e0);
  _local_470 = vsubps_avx(_local_540,_local_520);
  _local_480 = vsubps_avx(_local_450,_local_530);
  _local_490 = vsubps_avx(_local_510,_local_500);
  auVar325 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar331 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00a2a97e:
  local_440 = auVar331._0_16_;
  auVar101 = auVar325._0_16_;
  auVar79 = vshufps_avx(auVar101,auVar101,0x50);
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar324._16_4_ = 0x3f800000;
  auVar324._0_16_ = auVar319;
  auVar324._20_4_ = 0x3f800000;
  auVar324._24_4_ = 0x3f800000;
  auVar324._28_4_ = 0x3f800000;
  auVar196 = vsubps_avx(auVar319,auVar79);
  fVar191 = auVar79._0_4_;
  fVar244 = auVar79._4_4_;
  fVar209 = auVar79._8_4_;
  fVar245 = auVar79._12_4_;
  fVar215 = auVar196._0_4_;
  fVar246 = auVar196._4_4_;
  fVar210 = auVar196._8_4_;
  fVar247 = auVar196._12_4_;
  auVar164._0_4_ = auVar286._0_4_ * fVar191 + fVar215 * fVar227;
  auVar164._4_4_ = auVar286._4_4_ * fVar244 + fVar246 * fVar229;
  auVar164._8_4_ = auVar286._0_4_ * fVar209 + fVar210 * fVar227;
  auVar164._12_4_ = auVar286._4_4_ * fVar245 + fVar247 * fVar229;
  auVar134._0_4_ = auVar254._0_4_ * fVar191 + fVar215 * fVar213;
  auVar134._4_4_ = auVar254._4_4_ * fVar244 + fVar246 * fVar224;
  auVar134._8_4_ = auVar254._0_4_ * fVar209 + fVar210 * fVar213;
  auVar134._12_4_ = auVar254._4_4_ * fVar245 + fVar247 * fVar224;
  auVar237._0_4_ = auVar236._0_4_ * fVar191 + auVar318._0_4_ * fVar215;
  auVar237._4_4_ = auVar236._4_4_ * fVar244 + auVar318._4_4_ * fVar246;
  auVar237._8_4_ = auVar236._0_4_ * fVar209 + auVar318._0_4_ * fVar210;
  auVar237._12_4_ = auVar236._4_4_ * fVar245 + auVar318._4_4_ * fVar247;
  auVar176._0_4_ = auVar271._0_4_ * fVar191 + auVar314._0_4_ * fVar215;
  auVar176._4_4_ = auVar271._4_4_ * fVar244 + auVar314._4_4_ * fVar246;
  auVar176._8_4_ = auVar271._0_4_ * fVar209 + auVar314._0_4_ * fVar210;
  auVar176._12_4_ = auVar271._4_4_ * fVar245 + auVar314._4_4_ * fVar247;
  auVar79 = vmovshdup_avx(local_440);
  auVar196 = vshufps_avx(local_440,local_440,0);
  auVar276._16_16_ = auVar196;
  auVar276._0_16_ = auVar196;
  auVar151 = vshufps_avx(local_440,local_440,0x55);
  auVar94._16_16_ = auVar151;
  auVar94._0_16_ = auVar151;
  auVar90 = vsubps_avx(auVar94,auVar276);
  auVar151 = vshufps_avx(auVar164,auVar164,0);
  auVar119 = vshufps_avx(auVar164,auVar164,0x55);
  auVar107 = vshufps_avx(auVar134,auVar134,0);
  auVar137 = vshufps_avx(auVar134,auVar134,0x55);
  auVar108 = vshufps_avx(auVar237,auVar237,0);
  auVar228 = vshufps_avx(auVar237,auVar237,0x55);
  auVar6 = vshufps_avx(auVar176,auVar176,0);
  auVar74 = vshufps_avx(auVar176,auVar176,0x55);
  auVar79 = ZEXT416((uint)((auVar79._0_4_ - auVar331._0_4_) * 0.04761905));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar293._0_4_ = auVar196._0_4_ + auVar90._0_4_ * 0.0;
  auVar293._4_4_ = auVar196._4_4_ + auVar90._4_4_ * 0.14285715;
  auVar293._8_4_ = auVar196._8_4_ + auVar90._8_4_ * 0.2857143;
  auVar293._12_4_ = auVar196._12_4_ + auVar90._12_4_ * 0.42857146;
  auVar293._16_4_ = auVar196._0_4_ + auVar90._16_4_ * 0.5714286;
  auVar293._20_4_ = auVar196._4_4_ + auVar90._20_4_ * 0.71428573;
  auVar293._24_4_ = auVar196._8_4_ + auVar90._24_4_ * 0.8571429;
  auVar293._28_4_ = auVar196._12_4_ + auVar90._28_4_;
  auVar16 = vsubps_avx(auVar324,auVar293);
  fVar191 = auVar107._0_4_;
  fVar209 = auVar107._4_4_;
  fVar215 = auVar107._8_4_;
  fVar210 = auVar107._12_4_;
  fVar265 = auVar16._0_4_;
  fVar278 = auVar16._4_4_;
  fVar279 = auVar16._8_4_;
  fVar280 = auVar16._12_4_;
  fVar281 = auVar16._16_4_;
  fVar282 = auVar16._20_4_;
  fVar283 = auVar16._24_4_;
  fVar261 = auVar137._0_4_;
  fVar262 = auVar137._4_4_;
  fVar263 = auVar137._8_4_;
  fVar264 = auVar137._12_4_;
  fVar317 = auVar119._12_4_ + 1.0;
  fVar214 = auVar108._0_4_;
  fVar250 = auVar108._4_4_;
  fVar251 = auVar108._8_4_;
  fVar173 = auVar108._12_4_;
  fVar211 = fVar214 * auVar293._0_4_ + fVar265 * fVar191;
  fVar248 = fVar250 * auVar293._4_4_ + fVar278 * fVar209;
  fVar212 = fVar251 * auVar293._8_4_ + fVar279 * fVar215;
  fVar249 = fVar173 * auVar293._12_4_ + fVar280 * fVar210;
  fVar216 = fVar214 * auVar293._16_4_ + fVar281 * fVar191;
  fVar225 = fVar250 * auVar293._20_4_ + fVar282 * fVar209;
  fVar226 = fVar251 * auVar293._24_4_ + fVar283 * fVar215;
  fVar244 = auVar228._0_4_;
  fVar245 = auVar228._4_4_;
  fVar246 = auVar228._8_4_;
  fVar247 = auVar228._12_4_;
  fVar303 = fVar261 * fVar265 + auVar293._0_4_ * fVar244;
  fVar307 = fVar262 * fVar278 + auVar293._4_4_ * fVar245;
  fVar308 = fVar263 * fVar279 + auVar293._8_4_ * fVar246;
  fVar309 = fVar264 * fVar280 + auVar293._12_4_ * fVar247;
  fVar310 = fVar261 * fVar281 + auVar293._16_4_ * fVar244;
  fVar311 = fVar262 * fVar282 + auVar293._20_4_ * fVar245;
  fVar312 = fVar263 * fVar283 + auVar293._24_4_ * fVar246;
  fVar313 = fVar264 + fVar210;
  auVar196 = vshufps_avx(auVar164,auVar164,0xaa);
  auVar107 = vshufps_avx(auVar164,auVar164,0xff);
  fVar230 = fVar173 + 0.0;
  auVar137 = vshufps_avx(auVar134,auVar134,0xaa);
  auVar108 = vshufps_avx(auVar134,auVar134,0xff);
  auVar189._0_4_ =
       fVar265 * (auVar293._0_4_ * fVar191 + fVar265 * auVar151._0_4_) + auVar293._0_4_ * fVar211;
  auVar189._4_4_ =
       fVar278 * (auVar293._4_4_ * fVar209 + fVar278 * auVar151._4_4_) + auVar293._4_4_ * fVar248;
  auVar189._8_4_ =
       fVar279 * (auVar293._8_4_ * fVar215 + fVar279 * auVar151._8_4_) + auVar293._8_4_ * fVar212;
  auVar189._12_4_ =
       fVar280 * (auVar293._12_4_ * fVar210 + fVar280 * auVar151._12_4_) + auVar293._12_4_ * fVar249
  ;
  auVar189._16_4_ =
       fVar281 * (auVar293._16_4_ * fVar191 + fVar281 * auVar151._0_4_) + auVar293._16_4_ * fVar216;
  auVar189._20_4_ =
       fVar282 * (auVar293._20_4_ * fVar209 + fVar282 * auVar151._4_4_) + auVar293._20_4_ * fVar225;
  auVar189._24_4_ =
       fVar283 * (auVar293._24_4_ * fVar215 + fVar283 * auVar151._8_4_) + auVar293._24_4_ * fVar226;
  auVar189._28_4_ = auVar151._12_4_ + 1.0 + fVar247;
  auVar207._0_4_ =
       fVar265 * (fVar261 * auVar293._0_4_ + auVar119._0_4_ * fVar265) + auVar293._0_4_ * fVar303;
  auVar207._4_4_ =
       fVar278 * (fVar262 * auVar293._4_4_ + auVar119._4_4_ * fVar278) + auVar293._4_4_ * fVar307;
  auVar207._8_4_ =
       fVar279 * (fVar263 * auVar293._8_4_ + auVar119._8_4_ * fVar279) + auVar293._8_4_ * fVar308;
  auVar207._12_4_ =
       fVar280 * (fVar264 * auVar293._12_4_ + auVar119._12_4_ * fVar280) + auVar293._12_4_ * fVar309
  ;
  auVar207._16_4_ =
       fVar281 * (fVar261 * auVar293._16_4_ + auVar119._0_4_ * fVar281) + auVar293._16_4_ * fVar310;
  auVar207._20_4_ =
       fVar282 * (fVar262 * auVar293._20_4_ + auVar119._4_4_ * fVar282) + auVar293._20_4_ * fVar311;
  auVar207._24_4_ =
       fVar283 * (fVar263 * auVar293._24_4_ + auVar119._8_4_ * fVar283) + auVar293._24_4_ * fVar312;
  auVar207._28_4_ = auVar74._12_4_ + fVar247;
  auVar95._0_4_ =
       fVar265 * fVar211 + auVar293._0_4_ * (fVar214 * fVar265 + auVar6._0_4_ * auVar293._0_4_);
  auVar95._4_4_ =
       fVar278 * fVar248 + auVar293._4_4_ * (fVar250 * fVar278 + auVar6._4_4_ * auVar293._4_4_);
  auVar95._8_4_ =
       fVar279 * fVar212 + auVar293._8_4_ * (fVar251 * fVar279 + auVar6._8_4_ * auVar293._8_4_);
  auVar95._12_4_ =
       fVar280 * fVar249 + auVar293._12_4_ * (fVar173 * fVar280 + auVar6._12_4_ * auVar293._12_4_);
  auVar95._16_4_ =
       fVar281 * fVar216 + auVar293._16_4_ * (fVar214 * fVar281 + auVar6._0_4_ * auVar293._16_4_);
  auVar95._20_4_ =
       fVar282 * fVar225 + auVar293._20_4_ * (fVar250 * fVar282 + auVar6._4_4_ * auVar293._20_4_);
  auVar95._24_4_ =
       fVar283 * fVar226 + auVar293._24_4_ * (fVar251 * fVar283 + auVar6._8_4_ * auVar293._24_4_);
  auVar95._28_4_ = fVar210 + 1.0 + fVar230;
  auVar302._0_4_ =
       fVar265 * fVar303 + auVar293._0_4_ * (auVar74._0_4_ * auVar293._0_4_ + fVar265 * fVar244);
  auVar302._4_4_ =
       fVar278 * fVar307 + auVar293._4_4_ * (auVar74._4_4_ * auVar293._4_4_ + fVar278 * fVar245);
  auVar302._8_4_ =
       fVar279 * fVar308 + auVar293._8_4_ * (auVar74._8_4_ * auVar293._8_4_ + fVar279 * fVar246);
  auVar302._12_4_ =
       fVar280 * fVar309 + auVar293._12_4_ * (auVar74._12_4_ * auVar293._12_4_ + fVar280 * fVar247);
  auVar302._16_4_ =
       fVar281 * fVar310 + auVar293._16_4_ * (auVar74._0_4_ * auVar293._16_4_ + fVar281 * fVar244);
  auVar302._20_4_ =
       fVar282 * fVar311 + auVar293._20_4_ * (auVar74._4_4_ * auVar293._20_4_ + fVar282 * fVar245);
  auVar302._24_4_ =
       fVar283 * fVar312 + auVar293._24_4_ * (auVar74._8_4_ * auVar293._24_4_ + fVar283 * fVar246);
  auVar302._28_4_ = fVar230 + fVar247 + 0.0;
  local_220._0_4_ = fVar265 * auVar189._0_4_ + auVar293._0_4_ * auVar95._0_4_;
  local_220._4_4_ = fVar278 * auVar189._4_4_ + auVar293._4_4_ * auVar95._4_4_;
  local_220._8_4_ = fVar279 * auVar189._8_4_ + auVar293._8_4_ * auVar95._8_4_;
  local_220._12_4_ = fVar280 * auVar189._12_4_ + auVar293._12_4_ * auVar95._12_4_;
  local_220._16_4_ = fVar281 * auVar189._16_4_ + auVar293._16_4_ * auVar95._16_4_;
  local_220._20_4_ = fVar282 * auVar189._20_4_ + auVar293._20_4_ * auVar95._20_4_;
  local_220._24_4_ = fVar283 * auVar189._24_4_ + auVar293._24_4_ * auVar95._24_4_;
  local_220._28_4_ = fVar313 + fVar247 + 0.0;
  auVar172._0_4_ = fVar265 * auVar207._0_4_ + auVar293._0_4_ * auVar302._0_4_;
  auVar172._4_4_ = fVar278 * auVar207._4_4_ + auVar293._4_4_ * auVar302._4_4_;
  auVar172._8_4_ = fVar279 * auVar207._8_4_ + auVar293._8_4_ * auVar302._8_4_;
  auVar172._12_4_ = fVar280 * auVar207._12_4_ + auVar293._12_4_ * auVar302._12_4_;
  auVar172._16_4_ = fVar281 * auVar207._16_4_ + auVar293._16_4_ * auVar302._16_4_;
  auVar172._20_4_ = fVar282 * auVar207._20_4_ + auVar293._20_4_ * auVar302._20_4_;
  auVar172._24_4_ = fVar283 * auVar207._24_4_ + auVar293._24_4_ * auVar302._24_4_;
  auVar172._28_4_ = fVar313 + fVar230;
  auVar17 = vsubps_avx(auVar95,auVar189);
  auVar90 = vsubps_avx(auVar302,auVar207);
  local_660 = auVar79._0_4_;
  fStack_65c = auVar79._4_4_;
  fStack_658 = auVar79._8_4_;
  fStack_654 = auVar79._12_4_;
  local_260 = local_660 * auVar17._0_4_ * 3.0;
  fStack_25c = fStack_65c * auVar17._4_4_ * 3.0;
  auVar24._4_4_ = fStack_25c;
  auVar24._0_4_ = local_260;
  fStack_258 = fStack_658 * auVar17._8_4_ * 3.0;
  auVar24._8_4_ = fStack_258;
  fStack_254 = fStack_654 * auVar17._12_4_ * 3.0;
  auVar24._12_4_ = fStack_254;
  fStack_250 = local_660 * auVar17._16_4_ * 3.0;
  auVar24._16_4_ = fStack_250;
  fStack_24c = fStack_65c * auVar17._20_4_ * 3.0;
  auVar24._20_4_ = fStack_24c;
  fStack_248 = fStack_658 * auVar17._24_4_ * 3.0;
  auVar24._24_4_ = fStack_248;
  auVar24._28_4_ = auVar17._28_4_;
  local_280 = local_660 * auVar90._0_4_ * 3.0;
  fStack_27c = fStack_65c * auVar90._4_4_ * 3.0;
  auVar25._4_4_ = fStack_27c;
  auVar25._0_4_ = local_280;
  fStack_278 = fStack_658 * auVar90._8_4_ * 3.0;
  auVar25._8_4_ = fStack_278;
  fStack_274 = fStack_654 * auVar90._12_4_ * 3.0;
  auVar25._12_4_ = fStack_274;
  fStack_270 = local_660 * auVar90._16_4_ * 3.0;
  auVar25._16_4_ = fStack_270;
  fStack_26c = fStack_65c * auVar90._20_4_ * 3.0;
  auVar25._20_4_ = fStack_26c;
  fStack_268 = fStack_658 * auVar90._24_4_ * 3.0;
  auVar25._24_4_ = fStack_268;
  auVar25._28_4_ = fVar313;
  auVar14 = vsubps_avx(local_220,auVar24);
  auVar90 = vperm2f128_avx(auVar14,auVar14,1);
  auVar90 = vshufps_avx(auVar90,auVar14,0x30);
  auVar90 = vshufps_avx(auVar14,auVar90,0x29);
  auVar15 = vsubps_avx(auVar172,auVar25);
  auVar14 = vperm2f128_avx(auVar15,auVar15,1);
  auVar14 = vshufps_avx(auVar14,auVar15,0x30);
  auVar15 = vshufps_avx(auVar15,auVar14,0x29);
  fVar311 = auVar137._0_4_;
  fVar312 = auVar137._4_4_;
  fVar332 = auVar137._8_4_;
  fVar210 = auVar196._12_4_;
  fVar250 = auVar108._0_4_;
  fVar173 = auVar108._4_4_;
  fVar303 = auVar108._8_4_;
  fVar307 = auVar108._12_4_;
  auVar79 = vshufps_avx(auVar237,auVar237,0xaa);
  fVar191 = auVar79._0_4_;
  fVar209 = auVar79._4_4_;
  fVar215 = auVar79._8_4_;
  fVar247 = auVar79._12_4_;
  fVar212 = auVar293._0_4_ * fVar191 + fVar311 * fVar265;
  fVar249 = auVar293._4_4_ * fVar209 + fVar312 * fVar278;
  fVar216 = auVar293._8_4_ * fVar215 + fVar332 * fVar279;
  fVar225 = auVar293._12_4_ * fVar247 + auVar137._12_4_ * fVar280;
  fVar226 = auVar293._16_4_ * fVar191 + fVar311 * fVar281;
  fVar230 = auVar293._20_4_ * fVar209 + fVar312 * fVar282;
  fVar214 = auVar293._24_4_ * fVar215 + fVar332 * fVar283;
  auVar79 = vshufps_avx(auVar237,auVar237,0xff);
  fVar244 = auVar79._0_4_;
  fVar245 = auVar79._4_4_;
  fVar246 = auVar79._8_4_;
  fVar211 = auVar79._12_4_;
  fVar251 = auVar293._0_4_ * fVar244 + fVar250 * fVar265;
  fVar261 = auVar293._4_4_ * fVar245 + fVar173 * fVar278;
  fVar262 = auVar293._8_4_ * fVar246 + fVar303 * fVar279;
  fVar263 = auVar293._12_4_ * fVar211 + fVar307 * fVar280;
  fVar308 = auVar293._16_4_ * fVar244 + fVar250 * fVar281;
  fVar264 = auVar293._20_4_ * fVar245 + fVar173 * fVar282;
  fVar309 = auVar293._24_4_ * fVar246 + fVar303 * fVar283;
  auVar79 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar310 = auVar79._12_4_ + fVar247;
  auVar151 = vshufps_avx(auVar176,auVar176,0xff);
  fVar248 = auVar151._12_4_;
  auVar96._0_4_ =
       fVar265 * (fVar311 * auVar293._0_4_ + fVar265 * auVar196._0_4_) + auVar293._0_4_ * fVar212;
  auVar96._4_4_ =
       fVar278 * (fVar312 * auVar293._4_4_ + fVar278 * auVar196._4_4_) + auVar293._4_4_ * fVar249;
  auVar96._8_4_ =
       fVar279 * (fVar332 * auVar293._8_4_ + fVar279 * auVar196._8_4_) + auVar293._8_4_ * fVar216;
  auVar96._12_4_ =
       fVar280 * (auVar137._12_4_ * auVar293._12_4_ + fVar280 * fVar210) + auVar293._12_4_ * fVar225
  ;
  auVar96._16_4_ =
       fVar281 * (fVar311 * auVar293._16_4_ + fVar281 * auVar196._0_4_) + auVar293._16_4_ * fVar226;
  auVar96._20_4_ =
       fVar282 * (fVar312 * auVar293._20_4_ + fVar282 * auVar196._4_4_) + auVar293._20_4_ * fVar230;
  auVar96._24_4_ =
       fVar283 * (fVar332 * auVar293._24_4_ + fVar283 * auVar196._8_4_) + auVar293._24_4_ * fVar214;
  auVar96._28_4_ = auVar15._28_4_ + fVar210 + fVar248;
  auVar128._0_4_ =
       fVar265 * (fVar250 * auVar293._0_4_ + auVar107._0_4_ * fVar265) + auVar293._0_4_ * fVar251;
  auVar128._4_4_ =
       fVar278 * (fVar173 * auVar293._4_4_ + auVar107._4_4_ * fVar278) + auVar293._4_4_ * fVar261;
  auVar128._8_4_ =
       fVar279 * (fVar303 * auVar293._8_4_ + auVar107._8_4_ * fVar279) + auVar293._8_4_ * fVar262;
  auVar128._12_4_ =
       fVar280 * (fVar307 * auVar293._12_4_ + auVar107._12_4_ * fVar280) + auVar293._12_4_ * fVar263
  ;
  auVar128._16_4_ =
       fVar281 * (fVar250 * auVar293._16_4_ + auVar107._0_4_ * fVar281) + auVar293._16_4_ * fVar308;
  auVar128._20_4_ =
       fVar282 * (fVar173 * auVar293._20_4_ + auVar107._4_4_ * fVar282) + auVar293._20_4_ * fVar264;
  auVar128._24_4_ =
       fVar283 * (fVar303 * auVar293._24_4_ + auVar107._8_4_ * fVar283) + auVar293._24_4_ * fVar309;
  auVar128._28_4_ = fVar210 + auVar14._28_4_ + fVar248;
  auVar14 = vperm2f128_avx(local_220,local_220,1);
  auVar14 = vshufps_avx(auVar14,local_220,0x30);
  _local_560 = vshufps_avx(local_220,auVar14,0x29);
  auVar208._0_4_ =
       auVar293._0_4_ * (auVar79._0_4_ * auVar293._0_4_ + fVar265 * fVar191) + fVar265 * fVar212;
  auVar208._4_4_ =
       auVar293._4_4_ * (auVar79._4_4_ * auVar293._4_4_ + fVar278 * fVar209) + fVar278 * fVar249;
  auVar208._8_4_ =
       auVar293._8_4_ * (auVar79._8_4_ * auVar293._8_4_ + fVar279 * fVar215) + fVar279 * fVar216;
  auVar208._12_4_ =
       auVar293._12_4_ * (auVar79._12_4_ * auVar293._12_4_ + fVar280 * fVar247) + fVar280 * fVar225;
  auVar208._16_4_ =
       auVar293._16_4_ * (auVar79._0_4_ * auVar293._16_4_ + fVar281 * fVar191) + fVar281 * fVar226;
  auVar208._20_4_ =
       auVar293._20_4_ * (auVar79._4_4_ * auVar293._20_4_ + fVar282 * fVar209) + fVar282 * fVar230;
  auVar208._24_4_ =
       auVar293._24_4_ * (auVar79._8_4_ * auVar293._24_4_ + fVar283 * fVar215) + fVar283 * fVar214;
  auVar208._28_4_ = fVar310 + fVar317 + auVar207._28_4_;
  auVar260._0_4_ =
       fVar265 * fVar251 + auVar293._0_4_ * (auVar293._0_4_ * auVar151._0_4_ + fVar265 * fVar244);
  auVar260._4_4_ =
       fVar278 * fVar261 + auVar293._4_4_ * (auVar293._4_4_ * auVar151._4_4_ + fVar278 * fVar245);
  auVar260._8_4_ =
       fVar279 * fVar262 + auVar293._8_4_ * (auVar293._8_4_ * auVar151._8_4_ + fVar279 * fVar246);
  auVar260._12_4_ =
       fVar280 * fVar263 + auVar293._12_4_ * (auVar293._12_4_ * fVar248 + fVar280 * fVar211);
  auVar260._16_4_ =
       fVar281 * fVar308 + auVar293._16_4_ * (auVar293._16_4_ * auVar151._0_4_ + fVar281 * fVar244);
  auVar260._20_4_ =
       fVar282 * fVar264 + auVar293._20_4_ * (auVar293._20_4_ * auVar151._4_4_ + fVar282 * fVar245);
  auVar260._24_4_ =
       fVar283 * fVar309 + auVar293._24_4_ * (auVar293._24_4_ * auVar151._8_4_ + fVar283 * fVar246);
  auVar260._28_4_ = fVar317 + fVar307 + fVar248 + fVar211;
  auVar243._0_4_ = fVar265 * auVar96._0_4_ + auVar293._0_4_ * auVar208._0_4_;
  auVar243._4_4_ = fVar278 * auVar96._4_4_ + auVar293._4_4_ * auVar208._4_4_;
  auVar243._8_4_ = fVar279 * auVar96._8_4_ + auVar293._8_4_ * auVar208._8_4_;
  auVar243._12_4_ = fVar280 * auVar96._12_4_ + auVar293._12_4_ * auVar208._12_4_;
  auVar243._16_4_ = fVar281 * auVar96._16_4_ + auVar293._16_4_ * auVar208._16_4_;
  auVar243._20_4_ = fVar282 * auVar96._20_4_ + auVar293._20_4_ * auVar208._20_4_;
  auVar243._24_4_ = fVar283 * auVar96._24_4_ + auVar293._24_4_ * auVar208._24_4_;
  auVar243._28_4_ = fVar310 + fVar248 + fVar211;
  auVar277._0_4_ = fVar265 * auVar128._0_4_ + auVar293._0_4_ * auVar260._0_4_;
  auVar277._4_4_ = fVar278 * auVar128._4_4_ + auVar293._4_4_ * auVar260._4_4_;
  auVar277._8_4_ = fVar279 * auVar128._8_4_ + auVar293._8_4_ * auVar260._8_4_;
  auVar277._12_4_ = fVar280 * auVar128._12_4_ + auVar293._12_4_ * auVar260._12_4_;
  auVar277._16_4_ = fVar281 * auVar128._16_4_ + auVar293._16_4_ * auVar260._16_4_;
  auVar277._20_4_ = fVar282 * auVar128._20_4_ + auVar293._20_4_ * auVar260._20_4_;
  auVar277._24_4_ = fVar283 * auVar128._24_4_ + auVar293._24_4_ * auVar260._24_4_;
  auVar277._28_4_ = auVar16._28_4_ + auVar293._28_4_;
  auVar20 = vsubps_avx(auVar208,auVar96);
  auVar14 = vsubps_avx(auVar260,auVar128);
  local_2a0 = local_660 * auVar20._0_4_ * 3.0;
  fStack_29c = fStack_65c * auVar20._4_4_ * 3.0;
  auVar26._4_4_ = fStack_29c;
  auVar26._0_4_ = local_2a0;
  fStack_298 = fStack_658 * auVar20._8_4_ * 3.0;
  auVar26._8_4_ = fStack_298;
  fStack_294 = fStack_654 * auVar20._12_4_ * 3.0;
  auVar26._12_4_ = fStack_294;
  fStack_290 = local_660 * auVar20._16_4_ * 3.0;
  auVar26._16_4_ = fStack_290;
  fStack_28c = fStack_65c * auVar20._20_4_ * 3.0;
  auVar26._20_4_ = fStack_28c;
  fStack_288 = fStack_658 * auVar20._24_4_ * 3.0;
  auVar26._24_4_ = fStack_288;
  auVar26._28_4_ = auVar20._28_4_;
  local_2c0 = local_660 * auVar14._0_4_ * 3.0;
  fStack_2bc = fStack_65c * auVar14._4_4_ * 3.0;
  auVar27._4_4_ = fStack_2bc;
  auVar27._0_4_ = local_2c0;
  fStack_2b8 = fStack_658 * auVar14._8_4_ * 3.0;
  auVar27._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_654 * auVar14._12_4_ * 3.0;
  auVar27._12_4_ = fStack_2b4;
  fStack_2b0 = local_660 * auVar14._16_4_ * 3.0;
  auVar27._16_4_ = fStack_2b0;
  fStack_2ac = fStack_65c * auVar14._20_4_ * 3.0;
  auVar27._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_658 * auVar14._24_4_ * 3.0;
  auVar27._24_4_ = fStack_2a8;
  auVar27._28_4_ = auVar208._28_4_;
  auVar14 = vperm2f128_avx(auVar243,auVar243,1);
  auVar14 = vshufps_avx(auVar14,auVar243,0x30);
  auVar18 = vshufps_avx(auVar243,auVar14,0x29);
  auVar16 = vsubps_avx(auVar243,auVar26);
  auVar14 = vperm2f128_avx(auVar16,auVar16,1);
  auVar14 = vshufps_avx(auVar14,auVar16,0x30);
  auVar14 = vshufps_avx(auVar16,auVar14,0x29);
  auVar19 = vsubps_avx(auVar277,auVar27);
  auVar16 = vperm2f128_avx(auVar19,auVar19,1);
  auVar16 = vshufps_avx(auVar16,auVar19,0x30);
  local_200 = vshufps_avx(auVar19,auVar16,0x29);
  auVar21 = vsubps_avx(auVar243,local_220);
  auVar22 = vsubps_avx(auVar18,_local_560);
  fVar191 = auVar22._0_4_ + auVar21._0_4_;
  fVar244 = auVar22._4_4_ + auVar21._4_4_;
  fVar209 = auVar22._8_4_ + auVar21._8_4_;
  fVar245 = auVar22._12_4_ + auVar21._12_4_;
  fVar215 = auVar22._16_4_ + auVar21._16_4_;
  fVar246 = auVar22._20_4_ + auVar21._20_4_;
  fVar210 = auVar22._24_4_ + auVar21._24_4_;
  auVar16 = vperm2f128_avx(auVar172,auVar172,1);
  auVar16 = vshufps_avx(auVar16,auVar172,0x30);
  local_240 = vshufps_avx(auVar172,auVar16,0x29);
  auVar16 = vperm2f128_avx(auVar277,auVar277,1);
  auVar16 = vshufps_avx(auVar16,auVar277,0x30);
  auVar19 = vshufps_avx(auVar277,auVar16,0x29);
  auVar16 = vsubps_avx(auVar277,auVar172);
  auVar23 = vsubps_avx(auVar19,local_240);
  fVar247 = auVar23._0_4_ + auVar16._0_4_;
  fVar211 = auVar23._4_4_ + auVar16._4_4_;
  fVar248 = auVar23._8_4_ + auVar16._8_4_;
  fVar212 = auVar23._12_4_ + auVar16._12_4_;
  fVar249 = auVar23._16_4_ + auVar16._16_4_;
  fVar216 = auVar23._20_4_ + auVar16._20_4_;
  fVar225 = auVar23._24_4_ + auVar16._24_4_;
  auVar28._4_4_ = fVar244 * auVar172._4_4_;
  auVar28._0_4_ = fVar191 * auVar172._0_4_;
  auVar28._8_4_ = fVar209 * auVar172._8_4_;
  auVar28._12_4_ = fVar245 * auVar172._12_4_;
  auVar28._16_4_ = fVar215 * auVar172._16_4_;
  auVar28._20_4_ = fVar246 * auVar172._20_4_;
  auVar28._24_4_ = fVar210 * auVar172._24_4_;
  auVar28._28_4_ = auVar16._28_4_;
  auVar29._4_4_ = fVar211 * local_220._4_4_;
  auVar29._0_4_ = fVar247 * local_220._0_4_;
  auVar29._8_4_ = fVar248 * local_220._8_4_;
  auVar29._12_4_ = fVar212 * local_220._12_4_;
  auVar29._16_4_ = fVar249 * local_220._16_4_;
  auVar29._20_4_ = fVar216 * local_220._20_4_;
  auVar29._24_4_ = fVar225 * local_220._24_4_;
  auVar29._28_4_ = fVar310;
  auVar91 = vsubps_avx(auVar28,auVar29);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar17._28_4_;
  local_280 = local_280 + auVar172._0_4_;
  fStack_27c = fStack_27c + auVar172._4_4_;
  fStack_278 = fStack_278 + auVar172._8_4_;
  fStack_274 = fStack_274 + auVar172._12_4_;
  fStack_270 = fStack_270 + auVar172._16_4_;
  fStack_26c = fStack_26c + auVar172._20_4_;
  fStack_268 = fStack_268 + auVar172._24_4_;
  fStack_264 = fVar313 + auVar172._28_4_;
  auVar30._4_4_ = fVar244 * fStack_27c;
  auVar30._0_4_ = fVar191 * local_280;
  auVar30._8_4_ = fVar209 * fStack_278;
  auVar30._12_4_ = fVar245 * fStack_274;
  auVar30._16_4_ = fVar215 * fStack_270;
  auVar30._20_4_ = fVar246 * fStack_26c;
  auVar30._24_4_ = fVar210 * fStack_268;
  auVar30._28_4_ = fVar313;
  auVar31._4_4_ = fVar211 * fStack_25c;
  auVar31._0_4_ = fVar247 * local_260;
  auVar31._8_4_ = fVar248 * fStack_258;
  auVar31._12_4_ = fVar212 * fStack_254;
  auVar31._16_4_ = fVar249 * fStack_250;
  auVar31._20_4_ = fVar216 * fStack_24c;
  auVar31._24_4_ = fVar225 * fStack_248;
  auVar31._28_4_ = fVar313 + auVar172._28_4_;
  auVar17 = vsubps_avx(auVar30,auVar31);
  local_6c0 = auVar15._0_4_;
  fStack_6bc = auVar15._4_4_;
  fStack_6b8 = auVar15._8_4_;
  fStack_6b4 = auVar15._12_4_;
  fStack_6b0 = auVar15._16_4_;
  fStack_6ac = auVar15._20_4_;
  fStack_6a8 = auVar15._24_4_;
  auVar32._4_4_ = fVar244 * fStack_6bc;
  auVar32._0_4_ = fVar191 * local_6c0;
  auVar32._8_4_ = fVar209 * fStack_6b8;
  auVar32._12_4_ = fVar245 * fStack_6b4;
  auVar32._16_4_ = fVar215 * fStack_6b0;
  auVar32._20_4_ = fVar246 * fStack_6ac;
  auVar32._24_4_ = fVar210 * fStack_6a8;
  auVar32._28_4_ = fVar313;
  local_720._0_4_ = auVar90._0_4_;
  local_720._4_4_ = auVar90._4_4_;
  fStack_718 = auVar90._8_4_;
  fStack_714 = auVar90._12_4_;
  fStack_710 = auVar90._16_4_;
  fStack_70c = auVar90._20_4_;
  fStack_708 = auVar90._24_4_;
  auVar33._4_4_ = fVar211 * (float)local_720._4_4_;
  auVar33._0_4_ = fVar247 * (float)local_720._0_4_;
  auVar33._8_4_ = fVar248 * fStack_718;
  auVar33._12_4_ = fVar212 * fStack_714;
  auVar33._16_4_ = fVar249 * fStack_710;
  auVar33._20_4_ = fVar216 * fStack_70c;
  auVar33._24_4_ = fVar225 * fStack_708;
  auVar33._28_4_ = local_220._28_4_;
  auVar92 = vsubps_avx(auVar32,auVar33);
  auVar34._4_4_ = local_240._4_4_ * fVar244;
  auVar34._0_4_ = local_240._0_4_ * fVar191;
  auVar34._8_4_ = local_240._8_4_ * fVar209;
  auVar34._12_4_ = local_240._12_4_ * fVar245;
  auVar34._16_4_ = local_240._16_4_ * fVar215;
  auVar34._20_4_ = local_240._20_4_ * fVar246;
  auVar34._24_4_ = local_240._24_4_ * fVar210;
  auVar34._28_4_ = fVar313;
  auVar35._4_4_ = local_560._4_4_ * fVar211;
  auVar35._0_4_ = local_560._0_4_ * fVar247;
  auVar35._8_4_ = local_560._8_4_ * fVar248;
  auVar35._12_4_ = local_560._12_4_ * fVar212;
  auVar35._16_4_ = local_560._16_4_ * fVar249;
  auVar35._20_4_ = local_560._20_4_ * fVar216;
  auVar35._24_4_ = local_560._24_4_ * fVar225;
  auVar35._28_4_ = local_240._28_4_;
  local_660 = auVar14._0_4_;
  fStack_65c = auVar14._4_4_;
  fStack_658 = auVar14._8_4_;
  fStack_654 = auVar14._12_4_;
  fStack_650 = auVar14._16_4_;
  fStack_64c = auVar14._20_4_;
  fStack_648 = auVar14._24_4_;
  auVar93 = vsubps_avx(auVar34,auVar35);
  auVar36._4_4_ = auVar277._4_4_ * fVar244;
  auVar36._0_4_ = auVar277._0_4_ * fVar191;
  auVar36._8_4_ = auVar277._8_4_ * fVar209;
  auVar36._12_4_ = auVar277._12_4_ * fVar245;
  auVar36._16_4_ = auVar277._16_4_ * fVar215;
  auVar36._20_4_ = auVar277._20_4_ * fVar246;
  auVar36._24_4_ = auVar277._24_4_ * fVar210;
  auVar36._28_4_ = fVar313;
  auVar37._4_4_ = fVar211 * auVar243._4_4_;
  auVar37._0_4_ = fVar247 * auVar243._0_4_;
  auVar37._8_4_ = fVar248 * auVar243._8_4_;
  auVar37._12_4_ = fVar212 * auVar243._12_4_;
  auVar37._16_4_ = fVar249 * auVar243._16_4_;
  auVar37._20_4_ = fVar216 * auVar243._20_4_;
  auVar37._24_4_ = fVar225 * auVar243._24_4_;
  auVar37._28_4_ = fStack_244;
  auVar124 = vsubps_avx(auVar36,auVar37);
  local_2a0 = auVar243._0_4_ + local_2a0;
  fStack_29c = auVar243._4_4_ + fStack_29c;
  fStack_298 = auVar243._8_4_ + fStack_298;
  fStack_294 = auVar243._12_4_ + fStack_294;
  fStack_290 = auVar243._16_4_ + fStack_290;
  fStack_28c = auVar243._20_4_ + fStack_28c;
  fStack_288 = auVar243._24_4_ + fStack_288;
  fStack_284 = auVar243._28_4_ + auVar20._28_4_;
  local_2c0 = auVar277._0_4_ + local_2c0;
  fStack_2bc = auVar277._4_4_ + fStack_2bc;
  fStack_2b8 = auVar277._8_4_ + fStack_2b8;
  fStack_2b4 = auVar277._12_4_ + fStack_2b4;
  fStack_2b0 = auVar277._16_4_ + fStack_2b0;
  fStack_2ac = auVar277._20_4_ + fStack_2ac;
  fStack_2a8 = auVar277._24_4_ + fStack_2a8;
  fStack_2a4 = auVar277._28_4_ + auVar208._28_4_;
  auVar38._4_4_ = fVar244 * fStack_2bc;
  auVar38._0_4_ = fVar191 * local_2c0;
  auVar38._8_4_ = fVar209 * fStack_2b8;
  auVar38._12_4_ = fVar245 * fStack_2b4;
  auVar38._16_4_ = fVar215 * fStack_2b0;
  auVar38._20_4_ = fVar246 * fStack_2ac;
  auVar38._24_4_ = fVar210 * fStack_2a8;
  auVar38._28_4_ = auVar277._28_4_ + auVar208._28_4_;
  auVar39._4_4_ = fStack_29c * fVar211;
  auVar39._0_4_ = local_2a0 * fVar247;
  auVar39._8_4_ = fStack_298 * fVar248;
  auVar39._12_4_ = fStack_294 * fVar212;
  auVar39._16_4_ = fStack_290 * fVar249;
  auVar39._20_4_ = fStack_28c * fVar216;
  auVar39._24_4_ = fStack_288 * fVar225;
  auVar39._28_4_ = fStack_284;
  auVar20 = vsubps_avx(auVar38,auVar39);
  auVar40._4_4_ = fVar244 * local_200._4_4_;
  auVar40._0_4_ = fVar191 * local_200._0_4_;
  auVar40._8_4_ = fVar209 * local_200._8_4_;
  auVar40._12_4_ = fVar245 * local_200._12_4_;
  auVar40._16_4_ = fVar215 * local_200._16_4_;
  auVar40._20_4_ = fVar246 * local_200._20_4_;
  auVar40._24_4_ = fVar210 * local_200._24_4_;
  auVar40._28_4_ = fStack_284;
  auVar41._4_4_ = fVar211 * fStack_65c;
  auVar41._0_4_ = fVar247 * local_660;
  auVar41._8_4_ = fVar248 * fStack_658;
  auVar41._12_4_ = fVar212 * fStack_654;
  auVar41._16_4_ = fVar249 * fStack_650;
  auVar41._20_4_ = fVar216 * fStack_64c;
  auVar41._24_4_ = fVar225 * fStack_648;
  auVar41._28_4_ = local_200._28_4_;
  auVar125 = vsubps_avx(auVar40,auVar41);
  auVar42._4_4_ = fVar244 * auVar19._4_4_;
  auVar42._0_4_ = fVar191 * auVar19._0_4_;
  auVar42._8_4_ = fVar209 * auVar19._8_4_;
  auVar42._12_4_ = fVar245 * auVar19._12_4_;
  auVar42._16_4_ = fVar215 * auVar19._16_4_;
  auVar42._20_4_ = fVar246 * auVar19._20_4_;
  auVar42._24_4_ = fVar210 * auVar19._24_4_;
  auVar42._28_4_ = auVar22._28_4_ + auVar21._28_4_;
  auVar43._4_4_ = auVar18._4_4_ * fVar211;
  auVar43._0_4_ = auVar18._0_4_ * fVar247;
  auVar43._8_4_ = auVar18._8_4_ * fVar248;
  auVar43._12_4_ = auVar18._12_4_ * fVar212;
  auVar43._16_4_ = auVar18._16_4_ * fVar249;
  auVar43._20_4_ = auVar18._20_4_ * fVar216;
  auVar43._24_4_ = auVar18._24_4_ * fVar225;
  auVar43._28_4_ = auVar23._28_4_ + auVar16._28_4_;
  auVar21 = vsubps_avx(auVar42,auVar43);
  auVar14 = vminps_avx(auVar91,auVar17);
  auVar90 = vmaxps_avx(auVar91,auVar17);
  auVar15 = vminps_avx(auVar92,auVar93);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar92,auVar93);
  auVar90 = vmaxps_avx(auVar90,auVar14);
  auVar16 = vminps_avx(auVar124,auVar20);
  auVar14 = vmaxps_avx(auVar124,auVar20);
  auVar17 = vminps_avx(auVar125,auVar21);
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar17 = vminps_avx(auVar15,auVar17);
  auVar15 = vmaxps_avx(auVar125,auVar21);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar90,auVar14);
  auVar90 = vcmpps_avx(auVar17,local_1c0,2);
  auVar14 = vcmpps_avx(auVar14,local_1e0,5);
  auVar90 = vandps_avx(auVar14,auVar90);
  auVar14 = local_2e0 & auVar90;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(_local_560,local_220);
    auVar15 = vsubps_avx(auVar18,auVar243);
    fVar244 = auVar14._0_4_ + auVar15._0_4_;
    fVar209 = auVar14._4_4_ + auVar15._4_4_;
    fVar245 = auVar14._8_4_ + auVar15._8_4_;
    fVar215 = auVar14._12_4_ + auVar15._12_4_;
    fVar246 = auVar14._16_4_ + auVar15._16_4_;
    fVar210 = auVar14._20_4_ + auVar15._20_4_;
    fVar247 = auVar14._24_4_ + auVar15._24_4_;
    auVar17 = vsubps_avx(local_240,auVar172);
    auVar20 = vsubps_avx(auVar19,auVar277);
    fVar211 = auVar17._0_4_ + auVar20._0_4_;
    fVar248 = auVar17._4_4_ + auVar20._4_4_;
    fVar212 = auVar17._8_4_ + auVar20._8_4_;
    fVar249 = auVar17._12_4_ + auVar20._12_4_;
    fVar216 = auVar17._16_4_ + auVar20._16_4_;
    fVar225 = auVar17._20_4_ + auVar20._20_4_;
    fVar226 = auVar17._24_4_ + auVar20._24_4_;
    fVar191 = auVar20._28_4_;
    auVar44._4_4_ = auVar172._4_4_ * fVar209;
    auVar44._0_4_ = auVar172._0_4_ * fVar244;
    auVar44._8_4_ = auVar172._8_4_ * fVar245;
    auVar44._12_4_ = auVar172._12_4_ * fVar215;
    auVar44._16_4_ = auVar172._16_4_ * fVar246;
    auVar44._20_4_ = auVar172._20_4_ * fVar210;
    auVar44._24_4_ = auVar172._24_4_ * fVar247;
    auVar44._28_4_ = auVar172._28_4_;
    auVar45._4_4_ = local_220._4_4_ * fVar248;
    auVar45._0_4_ = local_220._0_4_ * fVar211;
    auVar45._8_4_ = local_220._8_4_ * fVar212;
    auVar45._12_4_ = local_220._12_4_ * fVar249;
    auVar45._16_4_ = local_220._16_4_ * fVar216;
    auVar45._20_4_ = local_220._20_4_ * fVar225;
    auVar45._24_4_ = local_220._24_4_ * fVar226;
    auVar45._28_4_ = local_220._28_4_;
    auVar20 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar209 * fStack_27c;
    auVar46._0_4_ = fVar244 * local_280;
    auVar46._8_4_ = fVar245 * fStack_278;
    auVar46._12_4_ = fVar215 * fStack_274;
    auVar46._16_4_ = fVar246 * fStack_270;
    auVar46._20_4_ = fVar210 * fStack_26c;
    auVar46._24_4_ = fVar247 * fStack_268;
    auVar46._28_4_ = auVar172._28_4_;
    auVar47._4_4_ = fVar248 * fStack_25c;
    auVar47._0_4_ = fVar211 * local_260;
    auVar47._8_4_ = fVar212 * fStack_258;
    auVar47._12_4_ = fVar249 * fStack_254;
    auVar47._16_4_ = fVar216 * fStack_250;
    auVar47._20_4_ = fVar225 * fStack_24c;
    auVar47._24_4_ = fVar226 * fStack_248;
    auVar47._28_4_ = fVar191;
    auVar21 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = fVar209 * fStack_6bc;
    auVar48._0_4_ = fVar244 * local_6c0;
    auVar48._8_4_ = fVar245 * fStack_6b8;
    auVar48._12_4_ = fVar215 * fStack_6b4;
    auVar48._16_4_ = fVar246 * fStack_6b0;
    auVar48._20_4_ = fVar210 * fStack_6ac;
    auVar48._24_4_ = fVar247 * fStack_6a8;
    auVar48._28_4_ = fVar191;
    auVar49._4_4_ = fVar248 * (float)local_720._4_4_;
    auVar49._0_4_ = fVar211 * (float)local_720._0_4_;
    auVar49._8_4_ = fVar212 * fStack_718;
    auVar49._12_4_ = fVar249 * fStack_714;
    auVar49._16_4_ = fVar216 * fStack_710;
    auVar49._20_4_ = fVar225 * fStack_70c;
    auVar49._24_4_ = fVar226 * fStack_708;
    auVar49._28_4_ = auVar16._28_4_;
    auVar22 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = local_240._4_4_ * fVar209;
    auVar50._0_4_ = local_240._0_4_ * fVar244;
    auVar50._8_4_ = local_240._8_4_ * fVar245;
    auVar50._12_4_ = local_240._12_4_ * fVar215;
    auVar50._16_4_ = local_240._16_4_ * fVar246;
    auVar50._20_4_ = local_240._20_4_ * fVar210;
    auVar50._24_4_ = local_240._24_4_ * fVar247;
    auVar50._28_4_ = auVar16._28_4_;
    auVar51._4_4_ = local_560._4_4_ * fVar248;
    auVar51._0_4_ = local_560._0_4_ * fVar211;
    auVar51._8_4_ = local_560._8_4_ * fVar212;
    auVar51._12_4_ = local_560._12_4_ * fVar249;
    auVar51._16_4_ = local_560._16_4_ * fVar216;
    auVar51._20_4_ = local_560._20_4_ * fVar225;
    uVar71 = local_560._28_4_;
    auVar51._24_4_ = local_560._24_4_ * fVar226;
    auVar51._28_4_ = uVar71;
    auVar23 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar277._4_4_ * fVar209;
    auVar52._0_4_ = auVar277._0_4_ * fVar244;
    auVar52._8_4_ = auVar277._8_4_ * fVar245;
    auVar52._12_4_ = auVar277._12_4_ * fVar215;
    auVar52._16_4_ = auVar277._16_4_ * fVar246;
    auVar52._20_4_ = auVar277._20_4_ * fVar210;
    auVar52._24_4_ = auVar277._24_4_ * fVar247;
    auVar52._28_4_ = uVar71;
    auVar53._4_4_ = auVar243._4_4_ * fVar248;
    auVar53._0_4_ = auVar243._0_4_ * fVar211;
    auVar53._8_4_ = auVar243._8_4_ * fVar212;
    auVar53._12_4_ = auVar243._12_4_ * fVar249;
    auVar53._16_4_ = auVar243._16_4_ * fVar216;
    auVar53._20_4_ = auVar243._20_4_ * fVar225;
    auVar53._24_4_ = auVar243._24_4_ * fVar226;
    auVar53._28_4_ = auVar243._28_4_;
    auVar91 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar209 * fStack_2bc;
    auVar54._0_4_ = fVar244 * local_2c0;
    auVar54._8_4_ = fVar245 * fStack_2b8;
    auVar54._12_4_ = fVar215 * fStack_2b4;
    auVar54._16_4_ = fVar246 * fStack_2b0;
    auVar54._20_4_ = fVar210 * fStack_2ac;
    auVar54._24_4_ = fVar247 * fStack_2a8;
    auVar54._28_4_ = uVar71;
    auVar55._4_4_ = fVar248 * fStack_29c;
    auVar55._0_4_ = fVar211 * local_2a0;
    auVar55._8_4_ = fVar212 * fStack_298;
    auVar55._12_4_ = fVar249 * fStack_294;
    auVar55._16_4_ = fVar216 * fStack_290;
    auVar55._20_4_ = fVar225 * fStack_28c;
    auVar55._24_4_ = fVar226 * fStack_288;
    auVar55._28_4_ = auVar277._28_4_;
    auVar92 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar209 * local_200._4_4_;
    auVar56._0_4_ = fVar244 * local_200._0_4_;
    auVar56._8_4_ = fVar245 * local_200._8_4_;
    auVar56._12_4_ = fVar215 * local_200._12_4_;
    auVar56._16_4_ = fVar246 * local_200._16_4_;
    auVar56._20_4_ = fVar210 * local_200._20_4_;
    auVar56._24_4_ = fVar247 * local_200._24_4_;
    auVar56._28_4_ = auVar277._28_4_;
    auVar57._4_4_ = fStack_65c * fVar248;
    auVar57._0_4_ = local_660 * fVar211;
    auVar57._8_4_ = fStack_658 * fVar212;
    auVar57._12_4_ = fStack_654 * fVar249;
    auVar57._16_4_ = fStack_650 * fVar216;
    auVar57._20_4_ = fStack_64c * fVar225;
    auVar57._24_4_ = fStack_648 * fVar226;
    auVar57._28_4_ = local_240._28_4_;
    auVar93 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = fVar209 * auVar19._4_4_;
    auVar58._0_4_ = fVar244 * auVar19._0_4_;
    auVar58._8_4_ = fVar245 * auVar19._8_4_;
    auVar58._12_4_ = fVar215 * auVar19._12_4_;
    auVar58._16_4_ = fVar246 * auVar19._16_4_;
    auVar58._20_4_ = fVar210 * auVar19._20_4_;
    auVar58._24_4_ = fVar247 * auVar19._24_4_;
    auVar58._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar59._4_4_ = auVar18._4_4_ * fVar248;
    auVar59._0_4_ = auVar18._0_4_ * fVar211;
    auVar59._8_4_ = auVar18._8_4_ * fVar212;
    auVar59._12_4_ = auVar18._12_4_ * fVar249;
    auVar59._16_4_ = auVar18._16_4_ * fVar216;
    auVar59._20_4_ = auVar18._20_4_ * fVar225;
    auVar59._24_4_ = auVar18._24_4_ * fVar226;
    auVar59._28_4_ = auVar17._28_4_ + fVar191;
    auVar19 = vsubps_avx(auVar58,auVar59);
    auVar15 = vminps_avx(auVar20,auVar21);
    auVar14 = vmaxps_avx(auVar20,auVar21);
    auVar16 = vminps_avx(auVar22,auVar23);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar22,auVar23);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar17 = vminps_avx(auVar91,auVar92);
    auVar15 = vmaxps_avx(auVar91,auVar92);
    auVar18 = vminps_avx(auVar93,auVar19);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar93,auVar19);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vcmpps_avx(auVar17,local_1c0,2);
    auVar15 = vcmpps_avx(auVar15,local_1e0,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar90 = vandps_avx(local_2e0,auVar90);
    auVar15 = auVar90 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar90 = vandps_avx(auVar14,auVar90);
      uVar64 = vmovmskps_avx(auVar90);
      if (uVar64 != 0) {
        auStack_4d0[uVar70] = uVar64 & 0xff;
        uVar2 = vmovlps_avx(local_440);
        *(undefined8 *)(afStack_360 + uVar70 * 2) = uVar2;
        uVar3 = vmovlps_avx(auVar101);
        auStack_1a0[uVar70] = uVar3;
        uVar70 = (ulong)((int)uVar70 + 1);
      }
    }
  }
LAB_00a2afed:
  do {
    do {
      do {
        do {
          if ((int)uVar70 == 0) {
            if (bVar72) goto LAB_00a2c074;
            uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar100._4_4_ = uVar71;
            auVar100._0_4_ = uVar71;
            auVar100._8_4_ = uVar71;
            auVar100._12_4_ = uVar71;
            auVar100._16_4_ = uVar71;
            auVar100._20_4_ = uVar71;
            auVar100._24_4_ = uVar71;
            auVar100._28_4_ = uVar71;
            auVar90 = vcmpps_avx(local_300,auVar100,2);
            uVar65 = vmovmskps_avx(auVar90);
            uVar66 = (ulong)((uint)uVar73 & uVar65);
            goto LAB_00a2a0f0;
          }
          uVar68 = (int)uVar70 - 1;
          uVar69 = (ulong)uVar68;
          uVar64 = auStack_4d0[uVar69];
          fVar191 = afStack_360[uVar69 * 2];
          fVar244 = afStack_360[uVar69 * 2 + 1];
          auVar320._8_8_ = 0;
          auVar320._0_8_ = auStack_1a0[uVar69];
          auVar325 = ZEXT1664(auVar320);
          uVar3 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar64 = uVar64 - 1 & uVar64;
          auStack_4d0[uVar69] = uVar64;
          if (uVar64 == 0) {
            uVar70 = (ulong)uVar68;
          }
          fVar245 = (float)(uVar3 + 1) * 0.14285715;
          fVar209 = (1.0 - (float)uVar3 * 0.14285715) * fVar191 +
                    fVar244 * (float)uVar3 * 0.14285715;
          fVar191 = (1.0 - fVar245) * fVar191 + fVar244 * fVar245;
          fVar244 = fVar191 - fVar209;
          if (0.16666667 <= fVar244) {
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar191),0x10);
            auVar331 = ZEXT1664(auVar79);
            goto LAB_00a2a97e;
          }
          auVar79 = vshufps_avx(auVar320,auVar320,0x50);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar196 = vsubps_avx(auVar105,auVar79);
          fVar245 = auVar79._0_4_;
          fVar215 = auVar79._4_4_;
          fVar246 = auVar79._8_4_;
          fVar210 = auVar79._12_4_;
          fVar247 = auVar196._0_4_;
          fVar211 = auVar196._4_4_;
          fVar248 = auVar196._8_4_;
          fVar212 = auVar196._12_4_;
          auVar135._0_4_ = auVar286._0_4_ * fVar245 + fVar247 * fVar227;
          auVar135._4_4_ = auVar286._4_4_ * fVar215 + fVar211 * fVar229;
          auVar135._8_4_ = auVar286._0_4_ * fVar246 + fVar248 * fVar227;
          auVar135._12_4_ = auVar286._4_4_ * fVar210 + fVar212 * fVar229;
          auVar177._0_4_ = auVar254._0_4_ * fVar245 + fVar247 * fVar213;
          auVar177._4_4_ = auVar254._4_4_ * fVar215 + fVar211 * fVar224;
          auVar177._8_4_ = auVar254._0_4_ * fVar246 + fVar248 * fVar213;
          auVar177._12_4_ = auVar254._4_4_ * fVar210 + fVar212 * fVar224;
          auVar199._0_4_ = auVar236._0_4_ * fVar245 + auVar318._0_4_ * fVar247;
          auVar199._4_4_ = auVar236._4_4_ * fVar215 + auVar318._4_4_ * fVar211;
          auVar199._8_4_ = auVar236._0_4_ * fVar246 + auVar318._0_4_ * fVar248;
          auVar199._12_4_ = auVar236._4_4_ * fVar210 + auVar318._4_4_ * fVar212;
          auVar76._0_4_ = auVar271._0_4_ * fVar245 + auVar314._0_4_ * fVar247;
          auVar76._4_4_ = auVar271._4_4_ * fVar215 + auVar314._4_4_ * fVar211;
          auVar76._8_4_ = auVar271._0_4_ * fVar246 + auVar314._0_4_ * fVar248;
          auVar76._12_4_ = auVar271._4_4_ * fVar210 + auVar314._4_4_ * fVar212;
          auVar129._16_16_ = auVar135;
          auVar129._0_16_ = auVar135;
          auVar156._16_16_ = auVar177;
          auVar156._0_16_ = auVar177;
          auVar190._16_16_ = auVar199;
          auVar190._0_16_ = auVar199;
          auVar90 = ZEXT2032(CONCAT416(fVar191,ZEXT416((uint)fVar209)));
          auVar90 = vshufps_avx(auVar90,auVar90,0);
          auVar14 = vsubps_avx(auVar156,auVar129);
          fVar245 = auVar90._0_4_;
          fVar215 = auVar90._4_4_;
          fVar246 = auVar90._8_4_;
          fVar210 = auVar90._12_4_;
          fVar247 = auVar90._16_4_;
          fVar211 = auVar90._20_4_;
          fVar248 = auVar90._24_4_;
          auVar130._0_4_ = auVar135._0_4_ + auVar14._0_4_ * fVar245;
          auVar130._4_4_ = auVar135._4_4_ + auVar14._4_4_ * fVar215;
          auVar130._8_4_ = auVar135._8_4_ + auVar14._8_4_ * fVar246;
          auVar130._12_4_ = auVar135._12_4_ + auVar14._12_4_ * fVar210;
          auVar130._16_4_ = auVar135._0_4_ + auVar14._16_4_ * fVar247;
          auVar130._20_4_ = auVar135._4_4_ + auVar14._20_4_ * fVar211;
          auVar130._24_4_ = auVar135._8_4_ + auVar14._24_4_ * fVar248;
          auVar130._28_4_ = auVar135._12_4_ + auVar14._28_4_;
          auVar90 = vsubps_avx(auVar190,auVar156);
          auVar157._0_4_ = auVar177._0_4_ + auVar90._0_4_ * fVar245;
          auVar157._4_4_ = auVar177._4_4_ + auVar90._4_4_ * fVar215;
          auVar157._8_4_ = auVar177._8_4_ + auVar90._8_4_ * fVar246;
          auVar157._12_4_ = auVar177._12_4_ + auVar90._12_4_ * fVar210;
          auVar157._16_4_ = auVar177._0_4_ + auVar90._16_4_ * fVar247;
          auVar157._20_4_ = auVar177._4_4_ + auVar90._20_4_ * fVar211;
          auVar157._24_4_ = auVar177._8_4_ + auVar90._24_4_ * fVar248;
          auVar157._28_4_ = auVar177._12_4_ + auVar90._28_4_;
          auVar79 = vsubps_avx(auVar76,auVar199);
          auVar97._0_4_ = auVar199._0_4_ + auVar79._0_4_ * fVar245;
          auVar97._4_4_ = auVar199._4_4_ + auVar79._4_4_ * fVar215;
          auVar97._8_4_ = auVar199._8_4_ + auVar79._8_4_ * fVar246;
          auVar97._12_4_ = auVar199._12_4_ + auVar79._12_4_ * fVar210;
          auVar97._16_4_ = auVar199._0_4_ + auVar79._0_4_ * fVar247;
          auVar97._20_4_ = auVar199._4_4_ + auVar79._4_4_ * fVar211;
          auVar97._24_4_ = auVar199._8_4_ + auVar79._8_4_ * fVar248;
          auVar97._28_4_ = auVar199._12_4_ + auVar79._12_4_;
          auVar90 = vsubps_avx(auVar157,auVar130);
          auVar131._0_4_ = auVar130._0_4_ + fVar245 * auVar90._0_4_;
          auVar131._4_4_ = auVar130._4_4_ + fVar215 * auVar90._4_4_;
          auVar131._8_4_ = auVar130._8_4_ + fVar246 * auVar90._8_4_;
          auVar131._12_4_ = auVar130._12_4_ + fVar210 * auVar90._12_4_;
          auVar131._16_4_ = auVar130._16_4_ + fVar247 * auVar90._16_4_;
          auVar131._20_4_ = auVar130._20_4_ + fVar211 * auVar90._20_4_;
          auVar131._24_4_ = auVar130._24_4_ + fVar248 * auVar90._24_4_;
          auVar131._28_4_ = auVar130._28_4_ + auVar90._28_4_;
          auVar90 = vsubps_avx(auVar97,auVar157);
          auVar98._0_4_ = auVar157._0_4_ + fVar245 * auVar90._0_4_;
          auVar98._4_4_ = auVar157._4_4_ + fVar215 * auVar90._4_4_;
          auVar98._8_4_ = auVar157._8_4_ + fVar246 * auVar90._8_4_;
          auVar98._12_4_ = auVar157._12_4_ + fVar210 * auVar90._12_4_;
          auVar98._16_4_ = auVar157._16_4_ + fVar247 * auVar90._16_4_;
          auVar98._20_4_ = auVar157._20_4_ + fVar211 * auVar90._20_4_;
          auVar98._24_4_ = auVar157._24_4_ + fVar248 * auVar90._24_4_;
          auVar98._28_4_ = auVar157._28_4_ + auVar90._28_4_;
          auVar90 = vsubps_avx(auVar98,auVar131);
          auVar220._0_4_ = auVar131._0_4_ + fVar245 * auVar90._0_4_;
          auVar220._4_4_ = auVar131._4_4_ + fVar215 * auVar90._4_4_;
          auVar220._8_4_ = auVar131._8_4_ + fVar246 * auVar90._8_4_;
          auVar220._12_4_ = auVar131._12_4_ + fVar210 * auVar90._12_4_;
          auVar223._16_4_ = auVar131._16_4_ + fVar247 * auVar90._16_4_;
          auVar223._0_16_ = auVar220;
          auVar223._20_4_ = auVar131._20_4_ + fVar211 * auVar90._20_4_;
          auVar223._24_4_ = auVar131._24_4_ + fVar248 * auVar90._24_4_;
          auVar223._28_4_ = auVar131._28_4_ + auVar157._28_4_;
          auVar228 = auVar223._16_16_;
          auVar107 = vshufps_avx(ZEXT416((uint)(fVar244 * 0.33333334)),
                                 ZEXT416((uint)(fVar244 * 0.33333334)),0);
          auVar178._0_4_ = auVar220._0_4_ + auVar107._0_4_ * auVar90._0_4_ * 3.0;
          auVar178._4_4_ = auVar220._4_4_ + auVar107._4_4_ * auVar90._4_4_ * 3.0;
          auVar178._8_4_ = auVar220._8_4_ + auVar107._8_4_ * auVar90._8_4_ * 3.0;
          auVar178._12_4_ = auVar220._12_4_ + auVar107._12_4_ * auVar90._12_4_ * 3.0;
          auVar151 = vshufpd_avx(auVar220,auVar220,3);
          auVar119 = vshufpd_avx(auVar228,auVar228,3);
          _local_560 = auVar151;
          auVar79 = vsubps_avx(auVar151,auVar220);
          auVar196 = vsubps_avx(auVar119,auVar228);
          auVar77._0_4_ = auVar79._0_4_ + auVar196._0_4_;
          auVar77._4_4_ = auVar79._4_4_ + auVar196._4_4_;
          auVar77._8_4_ = auVar79._8_4_ + auVar196._8_4_;
          auVar77._12_4_ = auVar79._12_4_ + auVar196._12_4_;
          auVar79 = vmovshdup_avx(auVar220);
          auVar196 = vmovshdup_avx(auVar178);
          auVar137 = vshufps_avx(auVar77,auVar77,0);
          auVar108 = vshufps_avx(auVar77,auVar77,0x55);
          fVar245 = auVar108._0_4_;
          fVar215 = auVar108._4_4_;
          fVar246 = auVar108._8_4_;
          fVar210 = auVar108._12_4_;
          fVar247 = auVar137._0_4_;
          fVar211 = auVar137._4_4_;
          fVar248 = auVar137._8_4_;
          fVar212 = auVar137._12_4_;
          auVar78._0_4_ = fVar247 * auVar220._0_4_ + auVar79._0_4_ * fVar245;
          auVar78._4_4_ = fVar211 * auVar220._4_4_ + auVar79._4_4_ * fVar215;
          auVar78._8_4_ = fVar248 * auVar220._8_4_ + auVar79._8_4_ * fVar246;
          auVar78._12_4_ = fVar212 * auVar220._12_4_ + auVar79._12_4_ * fVar210;
          auVar297._0_4_ = fVar247 * auVar178._0_4_ + auVar196._0_4_ * fVar245;
          auVar297._4_4_ = fVar211 * auVar178._4_4_ + auVar196._4_4_ * fVar215;
          auVar297._8_4_ = fVar248 * auVar178._8_4_ + auVar196._8_4_ * fVar246;
          auVar297._12_4_ = fVar212 * auVar178._12_4_ + auVar196._12_4_ * fVar210;
          auVar196 = vshufps_avx(auVar78,auVar78,0xe8);
          auVar137 = vshufps_avx(auVar297,auVar297,0xe8);
          auVar79 = vcmpps_avx(auVar196,auVar137,1);
          uVar64 = vextractps_avx(auVar79,0);
          auVar108 = auVar297;
          if ((uVar64 & 1) == 0) {
            auVar108 = auVar78;
          }
          auVar106._0_4_ = auVar107._0_4_ * auVar90._16_4_ * 3.0;
          auVar106._4_4_ = auVar107._4_4_ * auVar90._20_4_ * 3.0;
          auVar106._8_4_ = auVar107._8_4_ * auVar90._24_4_ * 3.0;
          auVar106._12_4_ = auVar107._12_4_ * 0.0;
          auVar74 = vsubps_avx(auVar228,auVar106);
          auVar107 = vmovshdup_avx(auVar74);
          auVar228 = vmovshdup_avx(auVar228);
          fVar249 = auVar74._0_4_;
          fVar216 = auVar74._4_4_;
          auVar200._0_4_ = fVar249 * fVar247 + auVar107._0_4_ * fVar245;
          auVar200._4_4_ = fVar216 * fVar211 + auVar107._4_4_ * fVar215;
          auVar200._8_4_ = auVar74._8_4_ * fVar248 + auVar107._8_4_ * fVar246;
          auVar200._12_4_ = auVar74._12_4_ * fVar212 + auVar107._12_4_ * fVar210;
          auVar328._0_4_ = fVar247 * auVar223._16_4_ + auVar228._0_4_ * fVar245;
          auVar328._4_4_ = fVar211 * auVar223._20_4_ + auVar228._4_4_ * fVar215;
          auVar328._8_4_ = fVar248 * auVar223._24_4_ + auVar228._8_4_ * fVar246;
          auVar328._12_4_ = fVar212 * auVar223._28_4_ + auVar228._12_4_ * fVar210;
          auVar228 = vshufps_avx(auVar200,auVar200,0xe8);
          auVar6 = vshufps_avx(auVar328,auVar328,0xe8);
          auVar107 = vcmpps_avx(auVar228,auVar6,1);
          uVar64 = vextractps_avx(auVar107,0);
          auVar101 = auVar328;
          if ((uVar64 & 1) == 0) {
            auVar101 = auVar200;
          }
          auVar108 = vmaxss_avx(auVar101,auVar108);
          auVar196 = vminps_avx(auVar196,auVar137);
          auVar137 = vminps_avx(auVar228,auVar6);
          auVar137 = vminps_avx(auVar196,auVar137);
          auVar79 = vshufps_avx(auVar79,auVar79,0x55);
          auVar79 = vblendps_avx(auVar79,auVar107,2);
          auVar107 = vpslld_avx(auVar79,0x1f);
          auVar79 = vshufpd_avx(auVar297,auVar297,1);
          auVar79 = vinsertps_avx(auVar79,auVar328,0x9c);
          auVar196 = vshufpd_avx(auVar78,auVar78,1);
          auVar196 = vinsertps_avx(auVar196,auVar200,0x9c);
          auVar79 = vblendvps_avx(auVar196,auVar79,auVar107);
          auVar196 = vmovshdup_avx(auVar79);
          auVar79 = vmaxss_avx(auVar196,auVar79);
          fVar246 = auVar137._0_4_;
          auVar196 = vmovshdup_avx(auVar137);
          fVar215 = auVar79._0_4_;
          fVar210 = auVar196._0_4_;
          fVar245 = auVar108._0_4_;
          if ((fVar246 < 0.0001) && (-0.0001 < fVar215)) break;
          if ((fVar210 < 0.0001 && -0.0001 < fVar245) || (fVar246 < 0.0001 && -0.0001 < fVar245))
          break;
          auVar107 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar79,1);
          auVar196 = vcmpps_avx(auVar196,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar196 = vandps_avx(auVar196,auVar107);
        } while ((auVar196 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar107 = vcmpps_avx(auVar137,_DAT_01f45a50,1);
        auVar196 = vcmpss_avx(auVar108,ZEXT416(0) << 0x20,1);
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar179._8_4_ = 0xbf800000;
        auVar179._0_8_ = 0xbf800000bf800000;
        auVar179._12_4_ = 0xbf800000;
        auVar196 = vblendvps_avx(auVar136,auVar179,auVar196);
        auVar107 = vblendvps_avx(auVar136,auVar179,auVar107);
        auVar137 = vcmpss_avx(auVar107,auVar196,4);
        auVar137 = vpshufd_avx(ZEXT416(auVar137._0_4_ & 1),0x50);
        auVar137 = vpslld_avx(auVar137,0x1f);
        auVar137 = vpsrad_avx(auVar137,0x1f);
        auVar137 = vpandn_avx(auVar137,_DAT_01f7afb0);
        auVar108 = vmovshdup_avx(auVar107);
        fVar247 = auVar108._0_4_;
        if ((auVar107._0_4_ != fVar247) || (NAN(auVar107._0_4_) || NAN(fVar247))) {
          if ((fVar210 != fVar246) || (NAN(fVar210) || NAN(fVar246))) {
            fVar246 = -fVar246 / (fVar210 - fVar246);
            auVar107 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar246) * 0.0 + fVar246)));
          }
          else {
            auVar107 = ZEXT816(0x3f80000000000000);
            if ((fVar246 != 0.0) || (NAN(fVar246))) {
              auVar107 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar228 = vcmpps_avx(auVar137,auVar107,1);
          auVar108 = vblendps_avx(auVar137,auVar107,2);
          auVar107 = vblendps_avx(auVar107,auVar137,2);
          auVar137 = vblendvps_avx(auVar107,auVar108,auVar228);
        }
        auVar79 = vcmpss_avx(auVar79,ZEXT416(0) << 0x20,1);
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar180._8_4_ = 0xbf800000;
        auVar180._0_8_ = 0xbf800000bf800000;
        auVar180._12_4_ = 0xbf800000;
        auVar79 = vblendvps_avx(auVar138,auVar180,auVar79);
        fVar246 = auVar79._0_4_;
        if ((auVar196._0_4_ != fVar246) || (NAN(auVar196._0_4_) || NAN(fVar246))) {
          if ((fVar215 != fVar245) || (NAN(fVar215) || NAN(fVar245))) {
            fVar245 = -fVar245 / (fVar215 - fVar245);
            auVar79 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar245) * 0.0 + fVar245)));
          }
          else {
            auVar79 = ZEXT816(0x3f80000000000000);
            if ((fVar245 != 0.0) || (NAN(fVar245))) {
              auVar79 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar107 = vcmpps_avx(auVar137,auVar79,1);
          auVar196 = vblendps_avx(auVar137,auVar79,2);
          auVar79 = vblendps_avx(auVar79,auVar137,2);
          auVar137 = vblendvps_avx(auVar79,auVar196,auVar107);
        }
        if ((fVar247 != fVar246) || (NAN(fVar247) || NAN(fVar246))) {
          auVar80._8_4_ = 0x3f800000;
          auVar80._0_8_ = 0x3f8000003f800000;
          auVar80._12_4_ = 0x3f800000;
          auVar79 = vcmpps_avx(auVar137,auVar80,1);
          auVar196 = vinsertps_avx(auVar137,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar139._4_12_ = auVar137._4_12_;
          auVar139._0_4_ = 0x3f800000;
          auVar137 = vblendvps_avx(auVar139,auVar196,auVar79);
        }
        auVar79 = vcmpps_avx(auVar137,_DAT_01f46740,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar137._4_12_;
        auVar196 = vinsertps_avx(auVar137,ZEXT416(0x3f800000),0x10);
        auVar79 = vblendvps_avx(auVar196,auVar61 << 0x20,auVar79);
        auVar196 = vmovshdup_avx(auVar79);
      } while (auVar196._0_4_ < auVar79._0_4_);
      auVar81._0_4_ = auVar79._0_4_ + -0.1;
      auVar81._4_4_ = auVar79._4_4_ + 0.1;
      auVar81._8_4_ = auVar79._8_4_ + 0.0;
      auVar81._12_4_ = auVar79._12_4_ + 0.0;
      auVar107 = vshufpd_avx(auVar178,auVar178,3);
      auVar221._8_8_ = 0x3f80000000000000;
      auVar221._0_8_ = 0x3f80000000000000;
      auVar79 = vcmpps_avx(auVar81,auVar221,1);
      auVar60._12_4_ = 0;
      auVar60._0_12_ = auVar81._4_12_;
      auVar196 = vinsertps_avx(auVar81,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar79 = vblendvps_avx(auVar196,auVar60 << 0x20,auVar79);
      auVar196 = vshufpd_avx(auVar74,auVar74,3);
      auVar137 = vshufps_avx(auVar79,auVar79,0x50);
      auVar321._8_4_ = 0x3f800000;
      auVar321._0_8_ = 0x3f8000003f800000;
      auVar321._12_4_ = 0x3f800000;
      auVar108 = vsubps_avx(auVar321,auVar137);
      local_560._0_4_ = auVar151._0_4_;
      local_560._4_4_ = auVar151._4_4_;
      fStack_558 = auVar151._8_4_;
      fStack_554 = auVar151._12_4_;
      fVar245 = auVar137._0_4_;
      fVar215 = auVar137._4_4_;
      fVar246 = auVar137._8_4_;
      fVar210 = auVar137._12_4_;
      local_680 = auVar119._0_4_;
      fStack_67c = auVar119._4_4_;
      fStack_678 = auVar119._8_4_;
      fStack_674 = auVar119._12_4_;
      fVar247 = auVar108._0_4_;
      fVar211 = auVar108._4_4_;
      fVar248 = auVar108._8_4_;
      fVar212 = auVar108._12_4_;
      auVar82._0_4_ = fVar245 * (float)local_560._0_4_ + fVar247 * auVar220._0_4_;
      auVar82._4_4_ = fVar215 * (float)local_560._4_4_ + fVar211 * auVar220._4_4_;
      auVar82._8_4_ = fVar246 * fStack_558 + fVar248 * auVar220._0_4_;
      auVar82._12_4_ = fVar210 * fStack_554 + fVar212 * auVar220._4_4_;
      auVar201._0_4_ = auVar107._0_4_ * fVar245 + fVar247 * auVar178._0_4_;
      auVar201._4_4_ = auVar107._4_4_ * fVar215 + fVar211 * auVar178._4_4_;
      auVar201._8_4_ = auVar107._8_4_ * fVar246 + fVar248 * auVar178._0_4_;
      auVar201._12_4_ = auVar107._12_4_ * fVar210 + fVar212 * auVar178._4_4_;
      auVar238._0_4_ = auVar196._0_4_ * fVar245 + fVar247 * fVar249;
      auVar238._4_4_ = auVar196._4_4_ * fVar215 + fVar211 * fVar216;
      auVar238._8_4_ = auVar196._8_4_ * fVar246 + fVar248 * fVar249;
      auVar238._12_4_ = auVar196._12_4_ * fVar210 + fVar212 * fVar216;
      auVar287._0_4_ = fVar245 * local_680 + fVar247 * auVar223._16_4_;
      auVar287._4_4_ = fVar215 * fStack_67c + fVar211 * auVar223._20_4_;
      auVar287._8_4_ = fVar246 * fStack_678 + fVar248 * auVar223._16_4_;
      auVar287._12_4_ = fVar210 * fStack_674 + fVar212 * auVar223._20_4_;
      auVar119 = vsubps_avx(auVar321,auVar79);
      auVar196 = vmovshdup_avx(auVar320);
      auVar151 = vmovsldup_avx(auVar320);
      auVar329._0_4_ = auVar119._0_4_ * auVar151._0_4_ + auVar79._0_4_ * auVar196._0_4_;
      auVar329._4_4_ = auVar119._4_4_ * auVar151._4_4_ + auVar79._4_4_ * auVar196._4_4_;
      auVar329._8_4_ = auVar119._8_4_ * auVar151._8_4_ + auVar79._8_4_ * auVar196._8_4_;
      auVar329._12_4_ = auVar119._12_4_ * auVar151._12_4_ + auVar79._12_4_ * auVar196._12_4_;
      auVar74 = vmovshdup_avx(auVar329);
      auVar79 = vsubps_avx(auVar201,auVar82);
      auVar140._0_4_ = auVar79._0_4_ * 3.0;
      auVar140._4_4_ = auVar79._4_4_ * 3.0;
      auVar140._8_4_ = auVar79._8_4_ * 3.0;
      auVar140._12_4_ = auVar79._12_4_ * 3.0;
      auVar79 = vsubps_avx(auVar238,auVar201);
      auVar165._0_4_ = auVar79._0_4_ * 3.0;
      auVar165._4_4_ = auVar79._4_4_ * 3.0;
      auVar165._8_4_ = auVar79._8_4_ * 3.0;
      auVar165._12_4_ = auVar79._12_4_ * 3.0;
      auVar79 = vsubps_avx(auVar287,auVar238);
      auVar255._0_4_ = auVar79._0_4_ * 3.0;
      auVar255._4_4_ = auVar79._4_4_ * 3.0;
      auVar255._8_4_ = auVar79._8_4_ * 3.0;
      auVar255._12_4_ = auVar79._12_4_ * 3.0;
      auVar196 = vminps_avx(auVar165,auVar255);
      auVar79 = vmaxps_avx(auVar165,auVar255);
      auVar196 = vminps_avx(auVar140,auVar196);
      auVar79 = vmaxps_avx(auVar140,auVar79);
      auVar151 = vshufpd_avx(auVar196,auVar196,3);
      auVar119 = vshufpd_avx(auVar79,auVar79,3);
      auVar196 = vminps_avx(auVar196,auVar151);
      auVar79 = vmaxps_avx(auVar79,auVar119);
      auVar151 = vshufps_avx(ZEXT416((uint)(1.0 / fVar244)),ZEXT416((uint)(1.0 / fVar244)),0);
      auVar256._0_4_ = auVar151._0_4_ * auVar196._0_4_;
      auVar256._4_4_ = auVar151._4_4_ * auVar196._4_4_;
      auVar256._8_4_ = auVar151._8_4_ * auVar196._8_4_;
      auVar256._12_4_ = auVar151._12_4_ * auVar196._12_4_;
      auVar272._0_4_ = auVar151._0_4_ * auVar79._0_4_;
      auVar272._4_4_ = auVar151._4_4_ * auVar79._4_4_;
      auVar272._8_4_ = auVar151._8_4_ * auVar79._8_4_;
      auVar272._12_4_ = auVar151._12_4_ * auVar79._12_4_;
      auVar108 = ZEXT416((uint)(1.0 / (auVar74._0_4_ - auVar329._0_4_)));
      auVar79 = vshufpd_avx(auVar82,auVar82,3);
      auVar196 = vshufpd_avx(auVar201,auVar201,3);
      auVar151 = vshufpd_avx(auVar238,auVar238,3);
      auVar119 = vshufpd_avx(auVar287,auVar287,3);
      auVar79 = vsubps_avx(auVar79,auVar82);
      auVar107 = vsubps_avx(auVar196,auVar201);
      auVar137 = vsubps_avx(auVar151,auVar238);
      auVar119 = vsubps_avx(auVar119,auVar287);
      auVar196 = vminps_avx(auVar79,auVar107);
      auVar79 = vmaxps_avx(auVar79,auVar107);
      auVar151 = vminps_avx(auVar137,auVar119);
      auVar151 = vminps_avx(auVar196,auVar151);
      auVar196 = vmaxps_avx(auVar137,auVar119);
      auVar79 = vmaxps_avx(auVar79,auVar196);
      auVar196 = vshufps_avx(auVar108,auVar108,0);
      auVar315._0_4_ = auVar196._0_4_ * auVar151._0_4_;
      auVar315._4_4_ = auVar196._4_4_ * auVar151._4_4_;
      auVar315._8_4_ = auVar196._8_4_ * auVar151._8_4_;
      auVar315._12_4_ = auVar196._12_4_ * auVar151._12_4_;
      auVar322._0_4_ = auVar196._0_4_ * auVar79._0_4_;
      auVar322._4_4_ = auVar196._4_4_ * auVar79._4_4_;
      auVar322._8_4_ = auVar196._8_4_ * auVar79._8_4_;
      auVar322._12_4_ = auVar196._12_4_ * auVar79._12_4_;
      auVar79 = vmovsldup_avx(auVar329);
      auVar288._4_12_ = auVar79._4_12_;
      auVar288._0_4_ = fVar209;
      auVar298._4_12_ = auVar329._4_12_;
      auVar298._0_4_ = fVar191;
      auVar166._0_4_ = (fVar209 + fVar191) * 0.5;
      auVar166._4_4_ = (auVar79._4_4_ + auVar329._4_4_) * 0.5;
      auVar166._8_4_ = (auVar79._8_4_ + auVar329._8_4_) * 0.5;
      auVar166._12_4_ = (auVar79._12_4_ + auVar329._12_4_) * 0.5;
      auVar79 = vshufps_avx(auVar166,auVar166,0);
      fVar245 = auVar79._0_4_;
      fVar215 = auVar79._4_4_;
      fVar246 = auVar79._8_4_;
      fVar210 = auVar79._12_4_;
      local_690._0_4_ = auVar4._0_4_;
      local_690._4_4_ = auVar4._4_4_;
      fStack_688 = auVar4._8_4_;
      fStack_684 = auVar4._12_4_;
      auVar109._0_4_ = fVar245 * (float)local_370._0_4_ + (float)local_690._0_4_;
      auVar109._4_4_ = fVar215 * (float)local_370._4_4_ + (float)local_690._4_4_;
      auVar109._8_4_ = fVar246 * fStack_368 + fStack_688;
      auVar109._12_4_ = fVar210 * fStack_364 + fStack_684;
      local_5b0 = auVar296._0_4_;
      fStack_5ac = auVar296._4_4_;
      fStack_5a8 = auVar296._8_4_;
      fStack_5a4 = auVar296._12_4_;
      auVar141._0_4_ = fVar245 * (float)local_380._0_4_ + local_5b0;
      auVar141._4_4_ = fVar215 * (float)local_380._4_4_ + fStack_5ac;
      auVar141._8_4_ = fVar246 * fStack_378 + fStack_5a8;
      auVar141._12_4_ = fVar210 * fStack_374 + fStack_5a4;
      local_5c0 = auVar5._0_4_;
      fStack_5bc = auVar5._4_4_;
      fStack_5b8 = auVar5._8_4_;
      fStack_5b4 = auVar5._12_4_;
      auVar202._0_4_ = fVar245 * (float)local_390._0_4_ + local_5c0;
      auVar202._4_4_ = fVar215 * (float)local_390._4_4_ + fStack_5bc;
      auVar202._8_4_ = fVar246 * fStack_388 + fStack_5b8;
      auVar202._12_4_ = fVar210 * fStack_384 + fStack_5b4;
      auVar79 = vsubps_avx(auVar141,auVar109);
      auVar110._0_4_ = auVar109._0_4_ + fVar245 * auVar79._0_4_;
      auVar110._4_4_ = auVar109._4_4_ + fVar215 * auVar79._4_4_;
      auVar110._8_4_ = auVar109._8_4_ + fVar246 * auVar79._8_4_;
      auVar110._12_4_ = auVar109._12_4_ + fVar210 * auVar79._12_4_;
      auVar79 = vsubps_avx(auVar202,auVar141);
      auVar142._0_4_ = auVar141._0_4_ + fVar245 * auVar79._0_4_;
      auVar142._4_4_ = auVar141._4_4_ + fVar215 * auVar79._4_4_;
      auVar142._8_4_ = auVar141._8_4_ + fVar246 * auVar79._8_4_;
      auVar142._12_4_ = auVar141._12_4_ + fVar210 * auVar79._12_4_;
      auVar79 = vsubps_avx(auVar142,auVar110);
      fVar245 = auVar110._0_4_ + fVar245 * auVar79._0_4_;
      fVar215 = auVar110._4_4_ + fVar215 * auVar79._4_4_;
      auVar83._0_8_ = CONCAT44(fVar215,fVar245);
      auVar83._8_4_ = auVar110._8_4_ + fVar246 * auVar79._8_4_;
      auVar83._12_4_ = auVar110._12_4_ + fVar210 * auVar79._12_4_;
      fVar246 = auVar79._0_4_ * 3.0;
      fVar210 = auVar79._4_4_ * 3.0;
      auVar111._0_8_ = CONCAT44(fVar210,fVar246);
      auVar111._8_4_ = auVar79._8_4_ * 3.0;
      auVar111._12_4_ = auVar79._12_4_ * 3.0;
      auVar143._8_8_ = auVar83._0_8_;
      auVar143._0_8_ = auVar83._0_8_;
      auVar79 = vshufpd_avx(auVar83,auVar83,3);
      auVar196 = vshufps_avx(auVar166,auVar166,0x55);
      auVar137 = vsubps_avx(auVar79,auVar143);
      auVar305._0_4_ = auVar137._0_4_ * auVar196._0_4_ + fVar245;
      auVar305._4_4_ = auVar137._4_4_ * auVar196._4_4_ + fVar215;
      auVar305._8_4_ = auVar137._8_4_ * auVar196._8_4_ + fVar245;
      auVar305._12_4_ = auVar137._12_4_ * auVar196._12_4_ + fVar215;
      auVar144._8_8_ = auVar111._0_8_;
      auVar144._0_8_ = auVar111._0_8_;
      auVar79 = vshufpd_avx(auVar111,auVar111,1);
      auVar79 = vsubps_avx(auVar79,auVar144);
      auVar112._0_4_ = auVar79._0_4_ * auVar196._0_4_ + fVar246;
      auVar112._4_4_ = auVar79._4_4_ * auVar196._4_4_ + fVar210;
      auVar112._8_4_ = auVar79._8_4_ * auVar196._8_4_ + fVar246;
      auVar112._12_4_ = auVar79._12_4_ * auVar196._12_4_ + fVar210;
      auVar196 = vmovshdup_avx(auVar112);
      auVar203._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
      auVar203._8_4_ = auVar196._8_4_ ^ 0x80000000;
      auVar203._12_4_ = auVar196._12_4_ ^ 0x80000000;
      auVar151 = vmovshdup_avx(auVar137);
      auVar79 = vunpcklps_avx(auVar151,auVar203);
      auVar119 = vshufps_avx(auVar79,auVar203,4);
      auVar84._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
      auVar84._8_4_ = -auVar137._8_4_;
      auVar84._12_4_ = -auVar137._12_4_;
      auVar79 = vmovlhps_avx(auVar84,auVar112);
      auVar107 = vshufps_avx(auVar79,auVar112,8);
      auVar79 = ZEXT416((uint)(auVar112._0_4_ * auVar151._0_4_ - auVar137._0_4_ * auVar196._0_4_));
      auVar196 = vshufps_avx(auVar79,auVar79,0);
      auVar79 = vdivps_avx(auVar119,auVar196);
      auVar196 = vdivps_avx(auVar107,auVar196);
      auVar107 = vinsertps_avx(auVar256,auVar315,0x1c);
      auVar137 = vinsertps_avx(auVar272,auVar322,0x1c);
      auVar108 = vinsertps_avx(auVar315,auVar256,0x4c);
      auVar228 = vinsertps_avx(auVar322,auVar272,0x4c);
      auVar151 = vmovsldup_avx(auVar79);
      auVar145._0_4_ = auVar151._0_4_ * auVar107._0_4_;
      auVar145._4_4_ = auVar151._4_4_ * auVar107._4_4_;
      auVar145._8_4_ = auVar151._8_4_ * auVar107._8_4_;
      auVar145._12_4_ = auVar151._12_4_ * auVar107._12_4_;
      auVar113._0_4_ = auVar137._0_4_ * auVar151._0_4_;
      auVar113._4_4_ = auVar137._4_4_ * auVar151._4_4_;
      auVar113._8_4_ = auVar137._8_4_ * auVar151._8_4_;
      auVar113._12_4_ = auVar137._12_4_ * auVar151._12_4_;
      auVar119 = vminps_avx(auVar145,auVar113);
      auVar151 = vmaxps_avx(auVar113,auVar145);
      auVar6 = vmovsldup_avx(auVar196);
      auVar323._0_4_ = auVar108._0_4_ * auVar6._0_4_;
      auVar323._4_4_ = auVar108._4_4_ * auVar6._4_4_;
      auVar323._8_4_ = auVar108._8_4_ * auVar6._8_4_;
      auVar323._12_4_ = auVar108._12_4_ * auVar6._12_4_;
      auVar146._0_4_ = auVar228._0_4_ * auVar6._0_4_;
      auVar146._4_4_ = auVar228._4_4_ * auVar6._4_4_;
      auVar146._8_4_ = auVar228._8_4_ * auVar6._8_4_;
      auVar146._12_4_ = auVar228._12_4_ * auVar6._12_4_;
      auVar6 = vminps_avx(auVar323,auVar146);
      auVar181._0_4_ = auVar119._0_4_ + auVar6._0_4_;
      auVar181._4_4_ = auVar119._4_4_ + auVar6._4_4_;
      auVar181._8_4_ = auVar119._8_4_ + auVar6._8_4_;
      auVar181._12_4_ = auVar119._12_4_ + auVar6._12_4_;
      auVar119 = vmaxps_avx(auVar146,auVar323);
      auVar6 = vsubps_avx(auVar288,auVar166);
      auVar101 = vsubps_avx(auVar298,auVar166);
      auVar114._0_4_ = auVar151._0_4_ + auVar119._0_4_;
      auVar114._4_4_ = auVar151._4_4_ + auVar119._4_4_;
      auVar114._8_4_ = auVar151._8_4_ + auVar119._8_4_;
      auVar114._12_4_ = auVar151._12_4_ + auVar119._12_4_;
      auVar147._8_8_ = 0x3f800000;
      auVar147._0_8_ = 0x3f800000;
      auVar151 = vsubps_avx(auVar147,auVar114);
      auVar119 = vsubps_avx(auVar147,auVar181);
      fVar248 = auVar6._0_4_;
      auVar182._0_4_ = fVar248 * auVar151._0_4_;
      fVar212 = auVar6._4_4_;
      auVar182._4_4_ = fVar212 * auVar151._4_4_;
      fVar249 = auVar6._8_4_;
      auVar182._8_4_ = fVar249 * auVar151._8_4_;
      fVar216 = auVar6._12_4_;
      auVar182._12_4_ = fVar216 * auVar151._12_4_;
      fVar246 = auVar101._0_4_;
      auVar115._0_4_ = fVar246 * auVar151._0_4_;
      fVar210 = auVar101._4_4_;
      auVar115._4_4_ = fVar210 * auVar151._4_4_;
      fVar247 = auVar101._8_4_;
      auVar115._8_4_ = fVar247 * auVar151._8_4_;
      fVar211 = auVar101._12_4_;
      auVar115._12_4_ = fVar211 * auVar151._12_4_;
      auVar289._0_4_ = fVar248 * auVar119._0_4_;
      auVar289._4_4_ = fVar212 * auVar119._4_4_;
      auVar289._8_4_ = fVar249 * auVar119._8_4_;
      auVar289._12_4_ = fVar216 * auVar119._12_4_;
      auVar148._0_4_ = fVar246 * auVar119._0_4_;
      auVar148._4_4_ = fVar210 * auVar119._4_4_;
      auVar148._8_4_ = fVar247 * auVar119._8_4_;
      auVar148._12_4_ = fVar211 * auVar119._12_4_;
      auVar151 = vminps_avx(auVar182,auVar289);
      auVar119 = vminps_avx(auVar115,auVar148);
      auVar6 = vminps_avx(auVar151,auVar119);
      auVar151 = vmaxps_avx(auVar289,auVar182);
      auVar119 = vmaxps_avx(auVar148,auVar115);
      auVar101 = vshufps_avx(auVar166,auVar166,0x54);
      auVar119 = vmaxps_avx(auVar119,auVar151);
      auVar102 = vshufps_avx(auVar305,auVar305,0);
      auVar133 = vshufps_avx(auVar305,auVar305,0x55);
      auVar151 = vhaddps_avx(auVar6,auVar6);
      auVar119 = vhaddps_avx(auVar119,auVar119);
      auVar167._0_4_ = auVar102._0_4_ * auVar79._0_4_ + auVar133._0_4_ * auVar196._0_4_;
      auVar167._4_4_ = auVar102._4_4_ * auVar79._4_4_ + auVar133._4_4_ * auVar196._4_4_;
      auVar167._8_4_ = auVar102._8_4_ * auVar79._8_4_ + auVar133._8_4_ * auVar196._8_4_;
      auVar167._12_4_ = auVar102._12_4_ * auVar79._12_4_ + auVar133._12_4_ * auVar196._12_4_;
      auVar6 = vsubps_avx(auVar101,auVar167);
      fVar245 = auVar6._0_4_ + auVar151._0_4_;
      fVar215 = auVar6._0_4_ + auVar119._0_4_;
      auVar151 = vmaxss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar245));
      auVar119 = vminss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar191));
    } while (auVar119._0_4_ < auVar151._0_4_);
    auVar151 = vmovshdup_avx(auVar79);
    auVar85._0_4_ = auVar151._0_4_ * auVar107._0_4_;
    auVar85._4_4_ = auVar151._4_4_ * auVar107._4_4_;
    auVar85._8_4_ = auVar151._8_4_ * auVar107._8_4_;
    auVar85._12_4_ = auVar151._12_4_ * auVar107._12_4_;
    auVar116._0_4_ = auVar137._0_4_ * auVar151._0_4_;
    auVar116._4_4_ = auVar137._4_4_ * auVar151._4_4_;
    auVar116._8_4_ = auVar137._8_4_ * auVar151._8_4_;
    auVar116._12_4_ = auVar137._12_4_ * auVar151._12_4_;
    auVar119 = vminps_avx(auVar85,auVar116);
    auVar151 = vmaxps_avx(auVar116,auVar85);
    auVar107 = vmovshdup_avx(auVar196);
    auVar183._0_4_ = auVar108._0_4_ * auVar107._0_4_;
    auVar183._4_4_ = auVar108._4_4_ * auVar107._4_4_;
    auVar183._8_4_ = auVar108._8_4_ * auVar107._8_4_;
    auVar183._12_4_ = auVar108._12_4_ * auVar107._12_4_;
    auVar117._0_4_ = auVar228._0_4_ * auVar107._0_4_;
    auVar117._4_4_ = auVar228._4_4_ * auVar107._4_4_;
    auVar117._8_4_ = auVar228._8_4_ * auVar107._8_4_;
    auVar117._12_4_ = auVar228._12_4_ * auVar107._12_4_;
    auVar107 = vminps_avx(auVar183,auVar117);
    auVar149._0_4_ = auVar119._0_4_ + auVar107._0_4_;
    auVar149._4_4_ = auVar119._4_4_ + auVar107._4_4_;
    auVar149._8_4_ = auVar119._8_4_ + auVar107._8_4_;
    auVar149._12_4_ = auVar119._12_4_ + auVar107._12_4_;
    auVar119 = vmaxps_avx(auVar117,auVar183);
    auVar86._0_4_ = auVar151._0_4_ + auVar119._0_4_;
    auVar86._4_4_ = auVar151._4_4_ + auVar119._4_4_;
    auVar86._8_4_ = auVar151._8_4_ + auVar119._8_4_;
    auVar86._12_4_ = auVar151._12_4_ + auVar119._12_4_;
    auVar151 = vsubps_avx(auVar221,auVar86);
    auVar119 = vsubps_avx(auVar221,auVar149);
    auVar150._0_4_ = fVar248 * auVar151._0_4_;
    auVar150._4_4_ = fVar212 * auVar151._4_4_;
    auVar150._8_4_ = fVar249 * auVar151._8_4_;
    auVar150._12_4_ = fVar216 * auVar151._12_4_;
    auVar184._0_4_ = fVar248 * auVar119._0_4_;
    auVar184._4_4_ = fVar212 * auVar119._4_4_;
    auVar184._8_4_ = fVar249 * auVar119._8_4_;
    auVar184._12_4_ = fVar216 * auVar119._12_4_;
    auVar87._0_4_ = fVar246 * auVar151._0_4_;
    auVar87._4_4_ = fVar210 * auVar151._4_4_;
    auVar87._8_4_ = fVar247 * auVar151._8_4_;
    auVar87._12_4_ = fVar211 * auVar151._12_4_;
    auVar118._0_4_ = fVar246 * auVar119._0_4_;
    auVar118._4_4_ = fVar210 * auVar119._4_4_;
    auVar118._8_4_ = fVar247 * auVar119._8_4_;
    auVar118._12_4_ = fVar211 * auVar119._12_4_;
    auVar151 = vminps_avx(auVar150,auVar184);
    auVar119 = vminps_avx(auVar87,auVar118);
    auVar151 = vminps_avx(auVar151,auVar119);
    auVar119 = vmaxps_avx(auVar184,auVar150);
    auVar107 = vmaxps_avx(auVar118,auVar87);
    auVar151 = vhaddps_avx(auVar151,auVar151);
    auVar119 = vmaxps_avx(auVar107,auVar119);
    auVar119 = vhaddps_avx(auVar119,auVar119);
    auVar107 = vmovshdup_avx(auVar6);
    auVar137 = ZEXT416((uint)(auVar107._0_4_ + auVar151._0_4_));
    auVar151 = vmaxss_avx(auVar329,auVar137);
    auVar107 = ZEXT416((uint)(auVar107._0_4_ + auVar119._0_4_));
    auVar119 = vminss_avx(auVar107,auVar74);
  } while (auVar119._0_4_ < auVar151._0_4_);
  uVar64 = 0;
  if ((fVar209 < fVar245) && (fVar215 < fVar191)) {
    auVar151 = vcmpps_avx(auVar107,auVar74,1);
    auVar119 = vcmpps_avx(auVar329,auVar137,1);
    auVar151 = vandps_avx(auVar119,auVar151);
    uVar64 = auVar151._0_4_;
  }
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  if (((uint)uVar70 < 4 && 0.001 <= fVar244) && (uVar64 & 1) == 0) goto LAB_00a2bfdb;
  lVar67 = 0xc9;
  do {
    lVar67 = lVar67 + -1;
    if (lVar67 == 0) goto LAB_00a2afed;
    fVar244 = auVar6._0_4_;
    fVar191 = 1.0 - fVar244;
    auVar151 = ZEXT416((uint)(fVar191 * fVar191 * fVar191));
    auVar151 = vshufps_avx(auVar151,auVar151,0);
    auVar119 = ZEXT416((uint)(fVar244 * 3.0 * fVar191 * fVar191));
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    auVar107 = ZEXT416((uint)(fVar191 * fVar244 * fVar244 * 3.0));
    auVar107 = vshufps_avx(auVar107,auVar107,0);
    auVar137 = ZEXT416((uint)(fVar244 * fVar244 * fVar244));
    auVar137 = vshufps_avx(auVar137,auVar137,0);
    fVar191 = (float)local_690._0_4_ * auVar151._0_4_ +
              local_5b0 * auVar119._0_4_ +
              (float)local_3a0._0_4_ * auVar137._0_4_ + local_5c0 * auVar107._0_4_;
    fVar244 = (float)local_690._4_4_ * auVar151._4_4_ +
              fStack_5ac * auVar119._4_4_ +
              (float)local_3a0._4_4_ * auVar137._4_4_ + fStack_5bc * auVar107._4_4_;
    auVar88._0_8_ = CONCAT44(fVar244,fVar191);
    auVar88._8_4_ =
         fStack_688 * auVar151._8_4_ +
         fStack_5a8 * auVar119._8_4_ + fStack_398 * auVar137._8_4_ + fStack_5b8 * auVar107._8_4_;
    auVar88._12_4_ =
         fStack_684 * auVar151._12_4_ +
         fStack_5a4 * auVar119._12_4_ + fStack_394 * auVar137._12_4_ + fStack_5b4 * auVar107._12_4_;
    auVar120._8_8_ = auVar88._0_8_;
    auVar120._0_8_ = auVar88._0_8_;
    auVar119 = vshufpd_avx(auVar88,auVar88,1);
    auVar151 = vmovshdup_avx(auVar6);
    auVar119 = vsubps_avx(auVar119,auVar120);
    auVar89._0_4_ = auVar151._0_4_ * auVar119._0_4_ + fVar191;
    auVar89._4_4_ = auVar151._4_4_ * auVar119._4_4_ + fVar244;
    auVar89._8_4_ = auVar151._8_4_ * auVar119._8_4_ + fVar191;
    auVar89._12_4_ = auVar151._12_4_ * auVar119._12_4_ + fVar244;
    auVar151 = vshufps_avx(auVar89,auVar89,0);
    auVar119 = vshufps_avx(auVar89,auVar89,0x55);
    auVar121._0_4_ = auVar79._0_4_ * auVar151._0_4_ + auVar196._0_4_ * auVar119._0_4_;
    auVar121._4_4_ = auVar79._4_4_ * auVar151._4_4_ + auVar196._4_4_ * auVar119._4_4_;
    auVar121._8_4_ = auVar79._8_4_ * auVar151._8_4_ + auVar196._8_4_ * auVar119._8_4_;
    auVar121._12_4_ = auVar79._12_4_ * auVar151._12_4_ + auVar196._12_4_ * auVar119._12_4_;
    auVar6 = vsubps_avx(auVar6,auVar121);
    auVar151 = vandps_avx(auVar257,auVar89);
    auVar119 = vshufps_avx(auVar151,auVar151,0xf5);
    auVar151 = vmaxss_avx(auVar119,auVar151);
  } while ((float)local_3b0._0_4_ <= auVar151._0_4_);
  fVar191 = auVar6._0_4_;
  if ((fVar191 < 0.0) || (1.0 < fVar191)) goto LAB_00a2afed;
  auVar79 = vmovshdup_avx(auVar6);
  fVar244 = auVar79._0_4_;
  if ((fVar244 < 0.0) || (1.0 < fVar244)) goto LAB_00a2afed;
  auVar79 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar228 = vinsertps_avx(auVar79,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar79 = vdpps_avx(auVar228,local_3c0,0x7f);
  auVar196 = vdpps_avx(auVar228,local_3d0,0x7f);
  auVar151 = vdpps_avx(auVar228,local_400,0x7f);
  auVar119 = vdpps_avx(auVar228,local_410,0x7f);
  auVar107 = vdpps_avx(auVar228,local_420,0x7f);
  auVar137 = vdpps_avx(auVar228,local_430,0x7f);
  fVar210 = 1.0 - fVar244;
  auVar108 = vdpps_avx(auVar228,local_3e0,0x7f);
  auVar228 = vdpps_avx(auVar228,local_3f0,0x7f);
  fVar247 = 1.0 - fVar191;
  fVar209 = auVar6._4_4_;
  fVar245 = auVar6._8_4_;
  fVar215 = auVar6._12_4_;
  fVar246 = fVar247 * fVar191 * fVar191 * 3.0;
  auVar204._0_4_ = fVar191 * fVar191 * fVar191;
  auVar204._4_4_ = fVar209 * fVar209 * fVar209;
  auVar204._8_4_ = fVar245 * fVar245 * fVar245;
  auVar204._12_4_ = fVar215 * fVar215 * fVar215;
  fVar209 = fVar191 * 3.0 * fVar247 * fVar247;
  fVar245 = fVar247 * fVar247 * fVar247;
  fVar191 = (fVar210 * auVar79._0_4_ + fVar244 * auVar151._0_4_) * fVar245 +
            (fVar210 * auVar196._0_4_ + fVar244 * auVar119._0_4_) * fVar209 +
            fVar246 * (fVar210 * auVar108._0_4_ + fVar244 * auVar107._0_4_) +
            auVar204._0_4_ * (auVar137._0_4_ * fVar244 + fVar210 * auVar228._0_4_);
  if ((fVar191 < fVar231) || (fVar244 = *(float *)(ray + k * 4 + 0x100), fVar244 < fVar191))
  goto LAB_00a2afed;
  pGVar8 = (context->scene->geometries).items[uVar65].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar62 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00a2bfbc;
    local_f0 = vshufps_avx(auVar6,auVar6,0x55);
    auVar258._8_4_ = 0x3f800000;
    auVar258._0_8_ = 0x3f8000003f800000;
    auVar258._12_4_ = 0x3f800000;
    auVar79 = vsubps_avx(auVar258,local_f0);
    fVar215 = local_f0._0_4_;
    fVar210 = local_f0._4_4_;
    fVar211 = local_f0._8_4_;
    fVar248 = local_f0._12_4_;
    fVar212 = auVar79._0_4_;
    fVar249 = auVar79._4_4_;
    fVar216 = auVar79._8_4_;
    fVar225 = auVar79._12_4_;
    auVar273._0_4_ = fVar215 * (float)local_4f0._0_4_ + fVar212 * (float)local_4e0._0_4_;
    auVar273._4_4_ = fVar210 * (float)local_4f0._4_4_ + fVar249 * (float)local_4e0._4_4_;
    auVar273._8_4_ = fVar211 * fStack_4e8 + fVar216 * fStack_4d8;
    auVar273._12_4_ = fVar248 * fStack_4e4 + fVar225 * fStack_4d4;
    auVar290._0_4_ = fVar215 * (float)local_540._0_4_ + fVar212 * (float)local_520._0_4_;
    auVar290._4_4_ = fVar210 * (float)local_540._4_4_ + fVar249 * (float)local_520._4_4_;
    auVar290._8_4_ = fVar211 * fStack_538 + fVar216 * fStack_518;
    auVar290._12_4_ = fVar248 * fStack_534 + fVar225 * fStack_514;
    auVar299._0_4_ = fVar215 * (float)local_450._0_4_ + fVar212 * (float)local_530._0_4_;
    auVar299._4_4_ = fVar210 * (float)local_450._4_4_ + fVar249 * (float)local_530._4_4_;
    auVar299._8_4_ = fVar211 * fStack_448 + fVar216 * fStack_528;
    auVar299._12_4_ = fVar248 * fStack_444 + fVar225 * fStack_524;
    auVar259._0_4_ = fVar215 * (float)local_510._0_4_ + fVar212 * (float)local_500._0_4_;
    auVar259._4_4_ = fVar210 * (float)local_510._4_4_ + fVar249 * (float)local_500._4_4_;
    auVar259._8_4_ = fVar211 * fStack_508 + fVar216 * fStack_4f8;
    auVar259._12_4_ = fVar248 * fStack_504 + fVar225 * fStack_4f4;
    auVar119 = vsubps_avx(auVar290,auVar273);
    auVar107 = vsubps_avx(auVar299,auVar290);
    auVar137 = vsubps_avx(auVar259,auVar299);
    local_110 = vshufps_avx(auVar6,auVar6,0);
    fVar215 = local_110._0_4_;
    fVar211 = local_110._4_4_;
    fVar248 = local_110._8_4_;
    fVar249 = local_110._12_4_;
    auVar79 = vshufps_avx(ZEXT416((uint)fVar247),ZEXT416((uint)fVar247),0);
    fVar210 = auVar79._0_4_;
    fVar247 = auVar79._4_4_;
    fVar212 = auVar79._8_4_;
    fVar216 = auVar79._12_4_;
    auVar79 = vshufps_avx(auVar204,auVar204,0);
    auVar196 = vshufps_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),0);
    auVar151 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
    auVar185._0_4_ =
         ((auVar107._0_4_ * fVar210 + auVar137._0_4_ * fVar215) * fVar215 +
         (auVar119._0_4_ * fVar210 + auVar107._0_4_ * fVar215) * fVar210) * 3.0;
    auVar185._4_4_ =
         ((auVar107._4_4_ * fVar247 + auVar137._4_4_ * fVar211) * fVar211 +
         (auVar119._4_4_ * fVar247 + auVar107._4_4_ * fVar211) * fVar247) * 3.0;
    auVar185._8_4_ =
         ((auVar107._8_4_ * fVar212 + auVar137._8_4_ * fVar248) * fVar248 +
         (auVar119._8_4_ * fVar212 + auVar107._8_4_ * fVar248) * fVar212) * 3.0;
    auVar185._12_4_ =
         ((auVar107._12_4_ * fVar216 + auVar137._12_4_ * fVar249) * fVar249 +
         (auVar119._12_4_ * fVar216 + auVar107._12_4_ * fVar249) * fVar216) * 3.0;
    auVar119 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
    auVar122._0_4_ =
         auVar119._0_4_ * (float)local_460._0_4_ +
         auVar151._0_4_ * (float)local_470._0_4_ +
         auVar79._0_4_ * (float)local_490._0_4_ + auVar196._0_4_ * (float)local_480._0_4_;
    auVar122._4_4_ =
         auVar119._4_4_ * (float)local_460._4_4_ +
         auVar151._4_4_ * (float)local_470._4_4_ +
         auVar79._4_4_ * (float)local_490._4_4_ + auVar196._4_4_ * (float)local_480._4_4_;
    auVar122._8_4_ =
         auVar119._8_4_ * fStack_458 +
         auVar151._8_4_ * fStack_468 + auVar79._8_4_ * fStack_488 + auVar196._8_4_ * fStack_478;
    auVar122._12_4_ =
         auVar119._12_4_ * fStack_454 +
         auVar151._12_4_ * fStack_464 + auVar79._12_4_ * fStack_484 + auVar196._12_4_ * fStack_474;
    auVar79 = vshufps_avx(auVar185,auVar185,0xc9);
    auVar152._0_4_ = auVar122._0_4_ * auVar79._0_4_;
    auVar152._4_4_ = auVar122._4_4_ * auVar79._4_4_;
    auVar152._8_4_ = auVar122._8_4_ * auVar79._8_4_;
    auVar152._12_4_ = auVar122._12_4_ * auVar79._12_4_;
    auVar79 = vshufps_avx(auVar122,auVar122,0xc9);
    auVar123._0_4_ = auVar185._0_4_ * auVar79._0_4_;
    auVar123._4_4_ = auVar185._4_4_ * auVar79._4_4_;
    auVar123._8_4_ = auVar185._8_4_ * auVar79._8_4_;
    auVar123._12_4_ = auVar185._12_4_ * auVar79._12_4_;
    auVar79 = vsubps_avx(auVar123,auVar152);
    local_170 = vshufps_avx(auVar79,auVar79,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar79,auVar79,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar79,auVar79,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_340._0_8_;
    uStack_d8 = local_340._8_8_;
    uStack_d0 = local_340._16_8_;
    uStack_c8 = local_340._24_8_;
    local_c0 = local_320;
    vcmpps_avx(local_320,local_320,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar191;
    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar63 & 0xf) << 4));
    local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar63 >> 4) * 0x10);
    local_4c0.valid = (int *)local_580;
    local_4c0.geometryUserPtr = pGVar8->userPtr;
    local_4c0.context = context->user;
    local_4c0.ray = (RTCRayN *)ray;
    local_4c0.hit = local_180;
    local_4c0.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_4c0);
    }
    auVar79 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
    auVar196 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
    auVar158._16_16_ = auVar196;
    auVar158._0_16_ = auVar79;
    auVar90 = _DAT_01f7b020 & ~auVar158;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0x7f,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar90 >> 0xbf,0) != '\0') ||
        (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar90[0x1f] < '\0')
    {
      p_Var9 = context->args->filter;
      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var9)(&local_4c0);
      }
      auVar79 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
      auVar196 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
      auVar99._16_16_ = auVar196;
      auVar99._0_16_ = auVar79;
      auVar132._8_4_ = 0xff800000;
      auVar132._0_8_ = 0xff800000ff800000;
      auVar132._12_4_ = 0xff800000;
      auVar132._16_4_ = 0xff800000;
      auVar132._20_4_ = 0xff800000;
      auVar132._24_4_ = 0xff800000;
      auVar132._28_4_ = 0xff800000;
      auVar90 = vblendvps_avx(auVar132,*(undefined1 (*) [32])(local_4c0.ray + 0x100),auVar99);
      *(undefined1 (*) [32])(local_4c0.ray + 0x100) = auVar90;
      auVar90 = _DAT_01f7b020 & ~auVar99;
      if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar90 >> 0x7f,0) != '\0') ||
            (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0xbf,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar90[0x1f] < '\0') {
        bVar62 = 1;
        goto LAB_00a2bfbc;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar244;
  }
  bVar62 = 0;
LAB_00a2bfbc:
  bVar72 = (bool)(bVar72 | bVar62);
  goto LAB_00a2afed;
LAB_00a2bfdb:
  auVar79 = vinsertps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar191),0x10);
  auVar331 = ZEXT1664(auVar79);
  auVar325 = ZEXT1664(auVar329);
  goto LAB_00a2a97e;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }